

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx::forward
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  uint uVar18;
  int *piVar19;
  void *pvVar20;
  undefined4 *puVar21;
  void *pvVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  int p;
  int iVar31;
  int iVar32;
  float *pfVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  float *pfVar37;
  uint uVar38;
  void *pvVar39;
  float *pfVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  uint uVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar75 [28];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [64];
  float fVar137;
  float fVar166;
  float fVar167;
  v4sf one;
  undefined1 auVar152 [28];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar186 [32];
  undefined1 auVar175 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar183 [16];
  undefined1 auVar196 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar216 [64];
  float fVar217;
  float fVar230;
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar234;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 in_ZMM7 [64];
  undefined1 auVar227 [64];
  float fVar235;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar241 [64];
  float fVar249;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  float fVar274;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar285 [32];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar286 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_150;
  undefined1 local_138 [16];
  size_t local_128;
  int local_120;
  Allocator *local_118;
  int local_110;
  int local_10c;
  undefined8 local_108;
  int local_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  ulong local_d0;
  InnerProduct_x86_avx *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar115 [32];
  undefined1 auVar121 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [32];
  undefined1 auVar159 [32];
  undefined1 auVar187 [32];
  undefined1 auVar193 [32];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar31 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar31;
  }
  iVar31 = cpu_support_x86_f16c();
  if ((iVar31 != 0) && (opt->use_fp16_storage == true)) {
    iVar31 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar31;
  }
  local_110 = bottom_blob->dims;
  if (local_110 == 2) {
    iVar31 = (this->super_InnerProduct).num_output;
    local_10c = bottom_blob->w;
    if (local_10c == (this->super_InnerProduct).weight_data_size / iVar31) {
      Mat::create(top_blob,iVar31,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_InnerProduct).bias_data.data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,
                 (Option *)CONCAT44(in_stack_fffffffffffffe8c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_10c = bottom_blob->w;
  }
  piVar19 = bottom_blob->refcount;
  local_138._0_8_ = bottom_blob->data;
  local_138._8_8_ = bottom_blob->refcount;
  local_128 = bottom_blob->elemsize;
  local_120 = bottom_blob->elempack;
  local_118 = bottom_blob->allocator;
  local_108._0_4_ = bottom_blob->h;
  local_108._4_4_ = bottom_blob->d;
  local_100 = bottom_blob->c;
  local_f8 = bottom_blob->cstep;
  iVar31 = local_110;
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + 1;
    UNLOCK();
    iVar31 = bottom_blob->dims;
  }
  if (iVar31 != 1) {
    auVar76[0] = opt->lightmode;
    auVar76[1] = opt->use_shader_pack8;
    auVar76[2] = opt->use_subgroup_ops;
    auVar76[3] = opt->use_reserved_0;
    auVar76._4_4_ = opt->num_threads;
    auVar76._8_8_ = opt->blob_allocator;
    uVar12 = opt->workspace_allocator;
    uVar13 = opt->openmp_blocktime;
    uVar14 = opt->use_winograd_convolution;
    uVar15 = opt->use_sgemm_convolution;
    uVar16 = opt->use_int8_inference;
    uVar17 = opt->use_vulkan_compute;
    auVar76[0x1f] = uVar17;
    auVar76[0x1e] = uVar16;
    auVar76[0x1d] = uVar15;
    auVar76[0x1c] = uVar14;
    auVar76._24_4_ = uVar13;
    auVar76._16_8_ = uVar12;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar76._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar76._16_16_;
    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_138);
    if ((local_138._0_8_ == 0) || ((long)local_100 * local_f8 == 0)) {
      iVar31 = -100;
      goto LAB_002fc05f;
    }
  }
  uVar18 = (this->super_InnerProduct).num_output;
  lVar44 = 1;
  if (opt->use_packing_layout == true) {
    lVar44 = 8;
    if ((uVar18 & 7) != 0) {
      lVar44 = (ulong)((uVar18 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar18 / (int)lVar44,lVar44 * (local_128 / (ulong)(long)local_120),
              (int)lVar44,opt->blob_allocator);
  auVar175 = in_ZMM12._0_16_;
  iVar31 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002fc05f;
  uVar18 = (this->super_InnerProduct).activation_type;
  pvVar20 = (this->super_InnerProduct).bias_data.data;
  uVar50 = local_120 * local_10c;
  iVar32 = top_blob->elempack;
  uVar38 = top_blob->w;
  iVar31 = 0;
  uVar30 = local_138._0_8_;
  if (iVar32 != 1) {
    if (iVar32 == 4) {
      if ((int)uVar38 < 1) goto LAB_002fc05f;
      uVar35 = 0;
      auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar268 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar216 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        fVar274 = 0.0;
        fVar277 = 0.0;
        fVar278 = 0.0;
        fVar279 = 0.0;
        if (pvVar20 != (void *)0x0) {
          pfVar40 = (float *)((long)pvVar20 + uVar35 * 0x10);
          fVar274 = *pfVar40;
          fVar277 = pfVar40[1];
          fVar278 = pfVar40[2];
          fVar279 = pfVar40[3];
        }
        pfVar40 = (float *)((long)(this->weight_data_tm).w * uVar35 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar33 = (float *)local_138._0_8_;
        if ((int)uVar50 < 8) {
          fVar287 = 0.0;
          fVar288 = 0.0;
          fVar289 = 0.0;
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar234 = 0.0;
          fVar284 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar217 = 0.0;
          fVar228 = 0.0;
          fVar280 = 0.0;
          fVar281 = 0.0;
          fVar282 = 0.0;
          fVar283 = 0.0;
          fVar86 = 0.0;
          fVar130 = 0.0;
          fVar131 = 0.0;
          uVar34 = 0;
        }
        else {
          fVar280 = 0.0;
          fVar281 = 0.0;
          fVar282 = 0.0;
          fVar283 = 0.0;
          fVar86 = 0.0;
          fVar130 = 0.0;
          fVar131 = 0.0;
          iVar31 = 7;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar217 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar234 = 0.0;
          fVar284 = 0.0;
          fVar287 = 0.0;
          fVar288 = 0.0;
          fVar289 = 0.0;
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          do {
            fVar137 = *pfVar33;
            fVar166 = pfVar33[1];
            fVar167 = pfVar33[2];
            fVar168 = pfVar33[3];
            fVar169 = pfVar33[4];
            fVar170 = pfVar33[6];
            fVar280 = fVar137 * *pfVar40 + fVar280;
            fVar281 = fVar137 * pfVar40[1] + fVar281;
            fVar282 = fVar137 * pfVar40[2] + fVar282;
            fVar283 = fVar137 * pfVar40[3] + fVar283;
            fVar86 = fVar166 * pfVar40[4] + fVar86;
            fVar130 = fVar166 * pfVar40[6] + fVar130;
            fVar131 = fVar166 + fVar131;
            fVar132 = fVar132 + fVar167 * pfVar40[8];
            fVar133 = fVar133 + fVar167 * pfVar40[9];
            fVar134 = fVar134 + fVar167 * pfVar40[10];
            fVar135 = fVar135 + fVar167 * pfVar40[0xb];
            fVar136 = fVar136 + fVar168 * pfVar40[0xc];
            fVar217 = fVar217 + fVar168 * pfVar40[0xe];
            fVar228 = fVar228 + fVar168;
            fVar229 = fVar169 * pfVar40[0x10] + fVar229;
            fVar230 = fVar169 * pfVar40[0x11] + fVar230;
            fVar231 = fVar169 * pfVar40[0x12] + fVar231;
            fVar232 = fVar169 * pfVar40[0x13] + fVar232;
            fVar233 = pfVar33[5] * pfVar40[0x14] + fVar233;
            fVar234 = pfVar33[5] * pfVar40[0x16] + fVar234;
            fVar284 = fVar166 + fVar284;
            fVar287 = fVar287 + fVar170 * pfVar40[0x18];
            fVar288 = fVar288 + fVar170 * pfVar40[0x19];
            fVar289 = fVar289 + fVar170 * pfVar40[0x1a];
            fVar290 = fVar290 + fVar170 * pfVar40[0x1b];
            fVar291 = fVar291 + pfVar33[7] * pfVar40[0x1c];
            fVar292 = fVar292 + pfVar33[7] * pfVar40[0x1e];
            fVar293 = fVar293 + fVar166;
            pfVar33 = pfVar33 + 8;
            pfVar40 = pfVar40 + 0x20;
            iVar31 = iVar31 + 8;
            uVar34 = uVar50 & 0xfffffff8;
          } while (iVar31 < (int)uVar50);
        }
        uVar45 = uVar34 | 3;
        while ((int)uVar45 < (int)uVar50) {
          fVar137 = *pfVar33;
          fVar166 = pfVar33[1];
          fVar167 = pfVar33[2];
          fVar168 = pfVar33[3];
          fVar280 = fVar137 * *pfVar40 + fVar280;
          fVar281 = fVar137 * pfVar40[1] + fVar281;
          fVar282 = fVar137 * pfVar40[2] + fVar282;
          fVar283 = fVar137 * pfVar40[3] + fVar283;
          fVar86 = fVar166 * pfVar40[4] + fVar86;
          fVar130 = fVar166 * pfVar40[6] + fVar130;
          fVar131 = fVar166 + fVar131;
          fVar132 = fVar132 + fVar167 * pfVar40[8];
          fVar133 = fVar133 + fVar167 * pfVar40[9];
          fVar134 = fVar134 + fVar167 * pfVar40[10];
          fVar135 = fVar135 + fVar167 * pfVar40[0xb];
          fVar136 = fVar136 + fVar168 * pfVar40[0xc];
          fVar217 = fVar217 + fVar168 * pfVar40[0xe];
          fVar228 = fVar228 + fVar168;
          pfVar33 = pfVar33 + 4;
          pfVar40 = pfVar40 + 0x10;
          uVar45 = uVar34 + 7;
          uVar34 = uVar34 + 4;
        }
        if (uVar50 - uVar34 != 0 && (int)uVar34 <= (int)uVar50) {
          lVar44 = 0;
          do {
            fVar137 = pfVar33[lVar44];
            fVar274 = fVar137 * *pfVar40 + fVar274;
            fVar277 = fVar137 * pfVar40[1] + fVar277;
            fVar278 = fVar137 * pfVar40[2] + fVar278;
            fVar279 = fVar137 * pfVar40[3] + fVar279;
            pfVar40 = pfVar40 + 4;
            lVar44 = lVar44 + 1;
          } while (uVar50 - uVar34 != (int)lVar44);
        }
        fVar281 = fVar288 + fVar230 + fVar133 + fVar281;
        auVar218._0_4_ =
             fVar291 + fVar233 + fVar136 + fVar86 + fVar287 + fVar229 + fVar132 + fVar280 + fVar274;
        auVar218._4_4_ = fVar281 + fVar281 + fVar277;
        auVar218._8_4_ =
             fVar292 + fVar234 + fVar217 + fVar130 + fVar289 + fVar231 + fVar134 + fVar282 + fVar278
        ;
        auVar218._12_4_ =
             fVar293 + fVar284 + fVar228 + fVar131 + fVar290 + fVar232 + fVar135 + fVar283 + fVar279
        ;
        auVar175 = auVar85._0_16_;
        fVar280 = auVar268._0_4_;
        fVar281 = auVar268._4_4_;
        fVar282 = auVar268._8_4_;
        fVar283 = auVar268._12_4_;
        auVar89 = auVar216._0_16_;
        fVar274 = auVar216._0_4_;
        fVar277 = auVar216._4_4_;
        fVar278 = auVar216._8_4_;
        fVar279 = auVar216._12_4_;
        switch(uVar18) {
        case 1:
          auVar218 = vmaxps_avx(auVar218,auVar175);
          break;
        case 2:
          auVar89 = vmaxps_avx(auVar218,auVar175);
          auVar175 = vminps_avx(auVar218,auVar175);
          fVar274 = *(this->super_InnerProduct).activation_params.data;
          auVar218._0_4_ = fVar274 * auVar175._0_4_ + auVar89._0_4_;
          auVar218._4_4_ = fVar274 * auVar175._4_4_ + auVar89._4_4_;
          auVar218._8_4_ = fVar274 * auVar175._8_4_ + auVar89._8_4_;
          auVar218._12_4_ = fVar274 * auVar175._12_4_ + auVar89._12_4_;
          break;
        case 3:
          puVar21 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar11 = *puVar21;
          auVar90._4_4_ = uVar11;
          auVar90._0_4_ = uVar11;
          auVar90._8_4_ = uVar11;
          auVar90._12_4_ = uVar11;
          uVar11 = puVar21[1];
          auVar147._4_4_ = uVar11;
          auVar147._0_4_ = uVar11;
          auVar147._8_4_ = uVar11;
          auVar147._12_4_ = uVar11;
          auVar175 = vmaxps_avx(auVar218,auVar90);
          auVar218 = vminps_avx(auVar175,auVar147);
          break;
        case 4:
          uVar42 = CONCAT44(auVar218._4_4_,auVar218._0_4_);
          auVar60._0_8_ = uVar42 ^ 0x8000000080000000;
          auVar60._8_4_ = -auVar218._8_4_;
          auVar60._12_4_ = -auVar218._12_4_;
          auVar91._8_4_ = 0x42b0c0a5;
          auVar91._0_8_ = 0x42b0c0a542b0c0a5;
          auVar91._12_4_ = 0x42b0c0a5;
          auVar175 = vminps_avx(auVar60,auVar91);
          auVar92._8_4_ = 0xc2b0c0a5;
          auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar92._12_4_ = 0xc2b0c0a5;
          auVar179 = vmaxps_avx(auVar175,auVar92);
          auVar93._0_4_ = fVar280 + auVar179._0_4_ * 1.442695;
          auVar93._4_4_ = fVar281 + auVar179._4_4_ * 1.442695;
          auVar93._8_4_ = fVar282 + auVar179._8_4_ * 1.442695;
          auVar93._12_4_ = fVar283 + auVar179._12_4_ * 1.442695;
          auVar148._0_4_ = (int)auVar93._0_4_;
          auVar148._4_4_ = (int)auVar93._4_4_;
          auVar148._8_4_ = (int)auVar93._8_4_;
          auVar148._12_4_ = (int)auVar93._12_4_;
          auVar218 = vcvtdq2ps_avx(auVar148);
          auVar175 = vcmpps_avx(auVar93,auVar218,1);
          auVar175 = vandps_avx(auVar175,auVar89);
          auVar175 = vsubps_avx(auVar218,auVar175);
          fVar86 = auVar179._0_4_ + auVar175._0_4_ * -0.6931472;
          fVar130 = auVar179._4_4_ + auVar175._4_4_ * -0.6931472;
          fVar131 = auVar179._8_4_ + auVar175._8_4_ * -0.6931472;
          fVar132 = auVar179._12_4_ + auVar175._12_4_ * -0.6931472;
          auVar94._0_4_ = (int)auVar175._0_4_;
          auVar94._4_4_ = (int)auVar175._4_4_;
          auVar94._8_4_ = (int)auVar175._8_4_;
          auVar94._12_4_ = (int)auVar175._12_4_;
          auVar175 = vpslld_avx(auVar94,0x17);
          auVar175 = vpaddd_avx(auVar175,auVar89);
          auVar61._0_4_ =
               (fVar86 + fVar274 +
               fVar86 * fVar86 *
               (fVar280 +
               ((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                0.041665796) * fVar86 + 0.16666666) * fVar86)) * auVar175._0_4_ + fVar274;
          auVar61._4_4_ =
               (fVar130 + fVar277 +
               fVar130 * fVar130 *
               (fVar281 +
               ((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                0.041665796) * fVar130 + 0.16666666) * fVar130)) * auVar175._4_4_ + fVar277;
          auVar61._8_4_ =
               (fVar131 + fVar278 +
               fVar131 * fVar131 *
               (fVar282 +
               ((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                0.041665796) * fVar131 + 0.16666666) * fVar131)) * auVar175._8_4_ + fVar278;
          auVar61._12_4_ =
               (fVar132 + fVar279 +
               fVar132 * fVar132 *
               (fVar283 +
               ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                0.041665796) * fVar132 + 0.16666666) * fVar132)) * auVar175._12_4_ + fVar279;
          auVar218 = vdivps_avx(auVar89,auVar61);
          break;
        case 5:
          auVar250._8_4_ = 0x42b0c0a5;
          auVar250._0_8_ = 0x42b0c0a542b0c0a5;
          auVar250._12_4_ = 0x42b0c0a5;
          auVar175 = vminps_avx(auVar250,auVar218);
          auVar261._8_4_ = 0xc2b0c0a5;
          auVar261._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar261._12_4_ = 0xc2b0c0a5;
          auVar88 = vmaxps_avx(auVar261,auVar175);
          auVar139._0_4_ = fVar280 + auVar88._0_4_ * 1.442695;
          auVar139._4_4_ = fVar281 + auVar88._4_4_ * 1.442695;
          auVar139._8_4_ = fVar282 + auVar88._8_4_ * 1.442695;
          auVar139._12_4_ = fVar283 + auVar88._12_4_ * 1.442695;
          auVar177._0_4_ = (int)auVar139._0_4_;
          auVar177._4_4_ = (int)auVar139._4_4_;
          auVar177._8_4_ = (int)auVar139._8_4_;
          auVar177._12_4_ = (int)auVar139._12_4_;
          auVar179 = vcvtdq2ps_avx(auVar177);
          auVar175 = vcmpps_avx(auVar139,auVar179,1);
          auVar175 = vandps_avx(auVar175,auVar89);
          auVar175 = vsubps_avx(auVar179,auVar175);
          auVar178._0_4_ = auVar175._0_4_ * 0.6931472;
          auVar178._4_4_ = auVar175._4_4_ * 0.6931472;
          auVar178._8_4_ = auVar175._8_4_ * 0.6931472;
          auVar178._12_4_ = auVar175._12_4_ * 0.6931472;
          auVar179 = vsubps_avx(auVar88,auVar178);
          fVar86 = auVar179._0_4_;
          fVar130 = auVar179._4_4_;
          fVar131 = auVar179._8_4_;
          fVar132 = auVar179._12_4_;
          auVar140._0_4_ = (int)auVar175._0_4_;
          auVar140._4_4_ = (int)auVar175._4_4_;
          auVar140._8_4_ = (int)auVar175._8_4_;
          auVar140._12_4_ = (int)auVar175._12_4_;
          auVar175 = vpslld_avx(auVar140,0x17);
          auVar175 = vpaddd_avx(auVar175,auVar89);
          auVar87._0_4_ =
               (fVar86 + fVar274 +
               fVar86 * fVar86 *
               (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                 0.041665796) * fVar86 + 0.16666666) * fVar86 + fVar280)) * auVar175._0_4_ + fVar274
          ;
          auVar87._4_4_ =
               (fVar130 + fVar277 +
               fVar130 * fVar130 *
               (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                 0.041665796) * fVar130 + 0.16666666) * fVar130 + fVar281)) * auVar175._4_4_ +
               fVar277;
          auVar87._8_4_ =
               (fVar131 + fVar278 +
               fVar131 * fVar131 *
               (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                 0.041665796) * fVar131 + 0.16666666) * fVar131 + fVar282)) * auVar175._8_4_ +
               fVar278;
          auVar87._12_4_ =
               (fVar132 + fVar279 +
               fVar132 * fVar132 *
               (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                 0.041665796) * fVar132 + 0.16666666) * fVar132 + fVar283)) * auVar175._12_4_ +
               fVar279;
          auVar141._8_4_ = 0x800000;
          auVar141._0_8_ = 0x80000000800000;
          auVar141._12_4_ = 0x800000;
          auVar175 = vmaxps_avx(auVar87,auVar141);
          auVar179 = vpsrld_avx(auVar175,0x17);
          auVar219._8_4_ = 0xffffff82;
          auVar219._0_8_ = 0xffffff82ffffff82;
          auVar219._12_4_ = 0xffffff82;
          auVar179 = vpaddd_avx(auVar179,auVar219);
          auVar220._8_4_ = 0x807fffff;
          auVar220._0_8_ = 0x807fffff807fffff;
          auVar220._12_4_ = 0x807fffff;
          auVar175 = vandps_avx(auVar175,auVar220);
          auVar139 = vorps_avx(auVar175,auVar268._0_16_);
          auVar88 = vcvtdq2ps_avx(auVar179);
          auVar221._8_4_ = 0x3f3504f3;
          auVar221._0_8_ = 0x3f3504f33f3504f3;
          auVar221._12_4_ = 0x3f3504f3;
          auVar179 = vcmpps_avx(auVar139,auVar221,1);
          auVar175 = vandps_avx(auVar179,auVar139);
          fVar86 = auVar175._0_4_ + auVar139._0_4_ + -1.0;
          fVar130 = auVar175._4_4_ + auVar139._4_4_ + -1.0;
          fVar131 = auVar175._8_4_ + auVar139._8_4_ + -1.0;
          fVar132 = auVar175._12_4_ + auVar139._12_4_ + -1.0;
          auVar175 = vandps_avx(auVar179,auVar89);
          auVar179 = vsubps_avx(auVar88,auVar175);
          auVar175 = vcmpps_avx(auVar87,_DAT_005a3030,2);
          auVar268 = ZEXT1664(auVar268._0_16_);
          auVar142._0_4_ =
               (auVar179._0_4_ * 0.6931472 + fVar86 +
               (((((((((fVar86 * 0.070376836 + -0.1151461) * fVar86 + 0.116769984) * fVar86 +
                     -0.12420141) * fVar86 + 0.14249323) * fVar86 + -0.16668057) * fVar86 +
                  0.20000714) * fVar86 + -0.24999994) * fVar86 + 0.3333333) * fVar86 + -0.5) *
               fVar86 * fVar86) * -2.0;
          auVar142._4_4_ =
               (auVar179._4_4_ * 0.6931472 + fVar130 +
               (((((((((fVar130 * 0.070376836 + -0.1151461) * fVar130 + 0.116769984) * fVar130 +
                     -0.12420141) * fVar130 + 0.14249323) * fVar130 + -0.16668057) * fVar130 +
                  0.20000714) * fVar130 + -0.24999994) * fVar130 + 0.3333333) * fVar130 + -0.5) *
               fVar130 * fVar130) * -2.0;
          auVar142._8_4_ =
               (auVar179._8_4_ * 0.6931472 + fVar131 +
               (((((((((fVar131 * 0.070376836 + -0.1151461) * fVar131 + 0.116769984) * fVar131 +
                     -0.12420141) * fVar131 + 0.14249323) * fVar131 + -0.16668057) * fVar131 +
                  0.20000714) * fVar131 + -0.24999994) * fVar131 + 0.3333333) * fVar131 + -0.5) *
               fVar131 * fVar131) * -2.0;
          auVar142._12_4_ =
               (auVar179._12_4_ * 0.6931472 + fVar132 +
               (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984) * fVar132 +
                     -0.12420141) * fVar132 + 0.14249323) * fVar132 + -0.16668057) * fVar132 +
                  0.20000714) * fVar132 + -0.24999994) * fVar132 + 0.3333333) * fVar132 + -0.5) *
               fVar132 * fVar132) * -2.0;
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar175 = vblendvps_avx(auVar142,auVar180,auVar175);
          auVar143._8_4_ = 0x42b0c0a5;
          auVar143._0_8_ = 0x42b0c0a542b0c0a5;
          auVar143._12_4_ = 0x42b0c0a5;
          auVar175 = vminps_avx(auVar175,auVar143);
          auVar88 = vmaxps_avx(auVar261,auVar175);
          auVar144._0_4_ = auVar88._0_4_ * 1.442695 + fVar280;
          auVar144._4_4_ = auVar88._4_4_ * 1.442695 + fVar281;
          auVar144._8_4_ = auVar88._8_4_ * 1.442695 + fVar282;
          auVar144._12_4_ = auVar88._12_4_ * 1.442695 + fVar283;
          auVar181._0_4_ = (int)auVar144._0_4_;
          auVar181._4_4_ = (int)auVar144._4_4_;
          auVar181._8_4_ = (int)auVar144._8_4_;
          auVar181._12_4_ = (int)auVar144._12_4_;
          auVar179 = vcvtdq2ps_avx(auVar181);
          auVar175 = vcmpps_avx(auVar144,auVar179,1);
          auVar175 = vandps_avx(auVar175,auVar89);
          auVar175 = vsubps_avx(auVar179,auVar175);
          auVar182._0_4_ = auVar175._0_4_ * 0.6931472;
          auVar182._4_4_ = auVar175._4_4_ * 0.6931472;
          auVar182._8_4_ = auVar175._8_4_ * 0.6931472;
          auVar182._12_4_ = auVar175._12_4_ * 0.6931472;
          auVar216 = ZEXT1664(auVar89);
          auVar179 = vsubps_avx(auVar88,auVar182);
          fVar86 = auVar179._0_4_;
          fVar130 = auVar179._4_4_;
          fVar131 = auVar179._8_4_;
          fVar132 = auVar179._12_4_;
          auVar85 = ZEXT864(0) << 0x20;
          auVar145._0_4_ = (int)auVar175._0_4_;
          auVar145._4_4_ = (int)auVar175._4_4_;
          auVar145._8_4_ = (int)auVar175._8_4_;
          auVar145._12_4_ = (int)auVar175._12_4_;
          auVar175 = vpslld_avx(auVar145,0x17);
          auVar175 = vpaddd_avx(auVar175,auVar89);
          auVar88._0_4_ =
               (fVar86 + fVar274 +
               fVar86 * fVar86 *
               (fVar280 +
               ((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                0.041665796) * fVar86 + 0.16666666) * fVar86)) * auVar175._0_4_ + fVar274;
          auVar88._4_4_ =
               (fVar130 + fVar277 +
               fVar130 * fVar130 *
               (fVar281 +
               ((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                0.041665796) * fVar130 + 0.16666666) * fVar130)) * auVar175._4_4_ + fVar277;
          auVar88._8_4_ =
               (fVar131 + fVar278 +
               fVar131 * fVar131 *
               (fVar282 +
               ((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                0.041665796) * fVar131 + 0.16666666) * fVar131)) * auVar175._8_4_ + fVar278;
          auVar88._12_4_ =
               (fVar132 + fVar279 +
               fVar132 * fVar132 *
               (fVar283 +
               ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                0.041665796) * fVar132 + 0.16666666) * fVar132)) * auVar175._12_4_ + fVar279;
          auVar146._8_4_ = 0x40000000;
          auVar146._0_8_ = 0x4000000040000000;
          auVar146._12_4_ = 0x40000000;
          auVar175 = vdivps_avx(auVar146,auVar88);
          auVar89._0_4_ = auVar175._0_4_ + -1.0;
          auVar89._4_4_ = auVar175._4_4_ + -1.0;
          auVar89._8_4_ = auVar175._8_4_ + -1.0;
          auVar89._12_4_ = auVar175._12_4_ + -1.0;
          goto LAB_002face1;
        case 6:
          pfVar40 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar274 = *pfVar40;
          fVar277 = pfVar40[1];
          auVar179._0_4_ = fVar274 * auVar218._0_4_ + fVar277;
          auVar179._4_4_ = fVar274 * auVar218._4_4_ + fVar277;
          auVar179._8_4_ = fVar274 * auVar218._8_4_ + fVar277;
          auVar179._12_4_ = fVar274 * auVar218._12_4_ + fVar277;
          auVar175 = vmaxps_avx(auVar179,auVar175);
          auVar89 = vminps_avx(auVar175,auVar89);
LAB_002face1:
          auVar218._0_4_ = auVar89._0_4_ * auVar218._0_4_;
          auVar218._4_4_ = auVar89._4_4_ * auVar218._4_4_;
          auVar218._8_4_ = auVar89._8_4_ * auVar218._8_4_;
          auVar218._12_4_ = auVar89._12_4_ * auVar218._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar35 * 0x10) = auVar218;
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar38);
    }
    else {
      iVar31 = 0;
      if ((iVar32 != 8) || ((int)uVar38 < 1)) goto LAB_002fc05f;
      uVar35 = 0;
      auVar216 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar85 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      do {
        fVar278 = 0.0;
        fVar279 = 0.0;
        fVar274 = 0.0;
        fVar277 = 0.0;
        fVar280 = 0.0;
        fVar281 = 0.0;
        fVar282 = 0.0;
        fVar283 = 0.0;
        if (pvVar20 != (void *)0x0) {
          pfVar40 = (float *)((long)pvVar20 + uVar35 * 0x20);
          fVar274 = *pfVar40;
          fVar277 = pfVar40[1];
          fVar278 = pfVar40[2];
          fVar279 = pfVar40[3];
          fVar280 = pfVar40[4];
          fVar281 = pfVar40[5];
          fVar282 = pfVar40[6];
          fVar283 = pfVar40[7];
        }
        pfVar40 = (float *)((long)(this->weight_data_tm).w * uVar35 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar33 = (float *)local_138._0_8_;
        if ((int)uVar50 < 8) {
          fVar137 = 0.0;
          fVar166 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar169 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar249 = 0.0;
          fVar254 = 0.0;
          fVar255 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar259 = 0.0;
          fVar260 = 0.0;
          fVar173 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar235 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          fVar245 = 0.0;
          fVar246 = 0.0;
          fVar247 = 0.0;
          fVar248 = 0.0;
          fVar284 = 0.0;
          fVar287 = 0.0;
          fVar288 = 0.0;
          fVar289 = 0.0;
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          fVar86 = 0.0;
          fVar130 = 0.0;
          fVar131 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar217 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar234 = 0.0;
          uVar34 = 0;
        }
        else {
          fVar217 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar234 = 0.0;
          iVar31 = 7;
          fVar86 = 0.0;
          fVar130 = 0.0;
          fVar131 = 0.0;
          fVar132 = 0.0;
          fVar133 = 0.0;
          fVar134 = 0.0;
          fVar135 = 0.0;
          fVar136 = 0.0;
          fVar284 = 0.0;
          fVar287 = 0.0;
          fVar288 = 0.0;
          fVar289 = 0.0;
          fVar290 = 0.0;
          fVar291 = 0.0;
          fVar292 = 0.0;
          fVar293 = 0.0;
          fVar235 = 0.0;
          fVar242 = 0.0;
          fVar243 = 0.0;
          fVar244 = 0.0;
          fVar245 = 0.0;
          fVar246 = 0.0;
          fVar247 = 0.0;
          fVar248 = 0.0;
          fVar173 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar249 = 0.0;
          fVar254 = 0.0;
          fVar255 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar259 = 0.0;
          fVar260 = 0.0;
          fVar137 = 0.0;
          fVar166 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar169 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          do {
            fVar7 = *pfVar33;
            fVar8 = pfVar33[1];
            fVar9 = pfVar33[2];
            fVar10 = pfVar33[3];
            fVar274 = fVar7 * *pfVar40 + fVar274;
            fVar277 = fVar7 * pfVar40[1] + fVar277;
            fVar278 = fVar7 * pfVar40[2] + fVar278;
            fVar279 = fVar7 * pfVar40[3] + fVar279;
            fVar280 = fVar7 * pfVar40[4] + fVar280;
            fVar281 = fVar7 * pfVar40[5] + fVar281;
            fVar282 = fVar7 * pfVar40[6] + fVar282;
            fVar283 = fVar7 + fVar283;
            fVar217 = fVar8 * pfVar40[8] + fVar217;
            fVar228 = fVar8 * pfVar40[9] + fVar228;
            fVar229 = fVar8 * pfVar40[10] + fVar229;
            fVar230 = fVar8 * pfVar40[0xb] + fVar230;
            fVar231 = fVar8 * pfVar40[0xc] + fVar231;
            fVar232 = fVar8 * pfVar40[0xd] + fVar232;
            fVar233 = fVar8 * pfVar40[0xe] + fVar233;
            fVar234 = fVar8 + fVar234;
            fVar86 = fVar9 * pfVar40[0x10] + fVar86;
            fVar130 = fVar9 * pfVar40[0x11] + fVar130;
            fVar131 = fVar9 * pfVar40[0x12] + fVar131;
            fVar132 = fVar9 * pfVar40[0x13] + fVar132;
            fVar133 = fVar9 * pfVar40[0x14] + fVar133;
            fVar134 = fVar9 * pfVar40[0x15] + fVar134;
            fVar135 = fVar9 * pfVar40[0x16] + fVar135;
            fVar136 = fVar7 + fVar136;
            fVar284 = fVar10 * pfVar40[0x18] + fVar284;
            fVar287 = fVar10 * pfVar40[0x19] + fVar287;
            fVar288 = fVar10 * pfVar40[0x1a] + fVar288;
            fVar289 = fVar10 * pfVar40[0x1b] + fVar289;
            fVar290 = fVar10 * pfVar40[0x1c] + fVar290;
            fVar291 = fVar10 * pfVar40[0x1d] + fVar291;
            fVar292 = fVar10 * pfVar40[0x1e] + fVar292;
            fVar293 = fVar7 + fVar293;
            fVar7 = pfVar33[4];
            fVar8 = pfVar33[5];
            fVar9 = pfVar33[6];
            fVar10 = pfVar33[7];
            fVar235 = fVar7 * pfVar40[0x20] + fVar235;
            fVar242 = fVar7 * pfVar40[0x21] + fVar242;
            fVar243 = fVar7 * pfVar40[0x22] + fVar243;
            fVar244 = fVar7 * pfVar40[0x23] + fVar244;
            fVar245 = fVar7 * pfVar40[0x24] + fVar245;
            fVar246 = fVar7 * pfVar40[0x25] + fVar246;
            fVar247 = fVar7 * pfVar40[0x26] + fVar247;
            fVar248 = fVar7 + fVar248;
            fVar173 = fVar8 * pfVar40[0x28] + fVar173;
            fVar197 = fVar8 * pfVar40[0x29] + fVar197;
            fVar198 = fVar8 * pfVar40[0x2a] + fVar198;
            fVar199 = fVar8 * pfVar40[0x2b] + fVar199;
            fVar200 = fVar8 * pfVar40[0x2c] + fVar200;
            fVar201 = fVar8 * pfVar40[0x2d] + fVar201;
            fVar202 = fVar8 * pfVar40[0x2e] + fVar202;
            fVar203 = fVar8 + fVar203;
            fVar249 = fVar9 * pfVar40[0x30] + fVar249;
            fVar254 = fVar9 * pfVar40[0x31] + fVar254;
            fVar255 = fVar9 * pfVar40[0x32] + fVar255;
            fVar256 = fVar9 * pfVar40[0x33] + fVar256;
            fVar257 = fVar9 * pfVar40[0x34] + fVar257;
            fVar258 = fVar9 * pfVar40[0x35] + fVar258;
            fVar259 = fVar9 * pfVar40[0x36] + fVar259;
            fVar260 = fVar7 + fVar260;
            fVar137 = fVar10 * pfVar40[0x38] + fVar137;
            fVar166 = fVar10 * pfVar40[0x39] + fVar166;
            fVar167 = fVar10 * pfVar40[0x3a] + fVar167;
            fVar168 = fVar10 * pfVar40[0x3b] + fVar168;
            fVar169 = fVar10 * pfVar40[0x3c] + fVar169;
            fVar170 = fVar10 * pfVar40[0x3d] + fVar170;
            fVar171 = fVar10 * pfVar40[0x3e] + fVar171;
            fVar172 = fVar7 + fVar172;
            pfVar33 = pfVar33 + 8;
            pfVar40 = pfVar40 + 0x40;
            iVar31 = iVar31 + 8;
            uVar34 = uVar50 & 0xfffffff8;
          } while (iVar31 < (int)uVar50);
        }
        uVar45 = uVar34 | 3;
        while ((int)uVar45 < (int)uVar50) {
          fVar7 = *pfVar33;
          fVar8 = pfVar33[1];
          fVar9 = pfVar33[2];
          fVar10 = pfVar33[3];
          fVar274 = fVar7 * *pfVar40 + fVar274;
          fVar277 = fVar7 * pfVar40[1] + fVar277;
          fVar278 = fVar7 * pfVar40[2] + fVar278;
          fVar279 = fVar7 * pfVar40[3] + fVar279;
          fVar280 = fVar7 * pfVar40[4] + fVar280;
          fVar281 = fVar7 * pfVar40[5] + fVar281;
          fVar282 = fVar7 * pfVar40[6] + fVar282;
          fVar283 = fVar7 + fVar283;
          fVar217 = fVar8 * pfVar40[8] + fVar217;
          fVar228 = fVar8 * pfVar40[9] + fVar228;
          fVar229 = fVar8 * pfVar40[10] + fVar229;
          fVar230 = fVar8 * pfVar40[0xb] + fVar230;
          fVar231 = fVar8 * pfVar40[0xc] + fVar231;
          fVar232 = fVar8 * pfVar40[0xd] + fVar232;
          fVar233 = fVar8 * pfVar40[0xe] + fVar233;
          fVar234 = fVar7 + fVar234;
          fVar86 = fVar9 * pfVar40[0x10] + fVar86;
          fVar130 = fVar9 * pfVar40[0x11] + fVar130;
          fVar131 = fVar9 * pfVar40[0x12] + fVar131;
          fVar132 = fVar9 * pfVar40[0x13] + fVar132;
          fVar133 = fVar9 * pfVar40[0x14] + fVar133;
          fVar134 = fVar9 * pfVar40[0x15] + fVar134;
          fVar135 = fVar9 * pfVar40[0x16] + fVar135;
          fVar136 = fVar7 + fVar136;
          fVar284 = fVar10 * pfVar40[0x18] + fVar284;
          fVar287 = fVar10 * pfVar40[0x19] + fVar287;
          fVar288 = fVar10 * pfVar40[0x1a] + fVar288;
          fVar289 = fVar10 * pfVar40[0x1b] + fVar289;
          fVar290 = fVar10 * pfVar40[0x1c] + fVar290;
          fVar291 = fVar10 * pfVar40[0x1d] + fVar291;
          fVar292 = fVar10 * pfVar40[0x1e] + fVar292;
          fVar293 = fVar8 + fVar293;
          pfVar33 = pfVar33 + 4;
          pfVar40 = pfVar40 + 0x20;
          uVar45 = uVar34 + 7;
          uVar34 = uVar34 + 4;
        }
        if (uVar50 - uVar34 != 0 && (int)uVar34 <= (int)uVar50) {
          lVar44 = 0;
          do {
            fVar7 = pfVar33[lVar44];
            fVar274 = fVar7 * *pfVar40 + fVar274;
            fVar277 = fVar7 * pfVar40[1] + fVar277;
            fVar278 = fVar7 * pfVar40[2] + fVar278;
            fVar279 = fVar7 * pfVar40[3] + fVar279;
            fVar280 = fVar7 * pfVar40[4] + fVar280;
            fVar281 = fVar7 * pfVar40[5] + fVar281;
            fVar282 = fVar7 * pfVar40[6] + fVar282;
            fVar283 = fVar7 + fVar283;
            pfVar40 = pfVar40 + 8;
            lVar44 = lVar44 + 1;
          } while (uVar50 - uVar34 != (int)lVar44);
        }
        fVar274 = fVar274 + fVar249 + fVar137 + fVar235 + fVar173 + fVar284 + fVar86 + fVar217;
        fVar277 = fVar277 + fVar254 + fVar166 + fVar242 + fVar197 + fVar287 + fVar130 + fVar228;
        auVar110._0_8_ = CONCAT44(fVar277,fVar274);
        auVar110._8_4_ =
             fVar278 + fVar255 + fVar167 + fVar243 + fVar198 + fVar288 + fVar131 + fVar229;
        auVar110._12_4_ =
             fVar279 + fVar256 + fVar168 + fVar244 + fVar199 + fVar289 + fVar132 + fVar230;
        auVar110._16_4_ =
             fVar280 + fVar257 + fVar169 + fVar245 + fVar200 + fVar290 + fVar133 + fVar231;
        auVar110._20_4_ =
             fVar281 + fVar258 + fVar170 + fVar246 + fVar201 + fVar291 + fVar134 + fVar232;
        auVar110._24_4_ =
             fVar282 + fVar259 + fVar171 + fVar247 + fVar202 + fVar292 + fVar135 + fVar233;
        auVar110._28_4_ =
             fVar283 + fVar260 + fVar172 + fVar248 + fVar203 + fVar293 + fVar136 + fVar234;
        auVar76 = auVar85._0_32_;
        fVar280 = auVar216._4_4_;
        fVar282 = auVar216._8_4_;
        fVar86 = auVar216._12_4_;
        fVar131 = auVar216._16_4_;
        fVar134 = auVar216._20_4_;
        fVar135 = auVar216._24_4_;
        fVar217 = auVar216._28_4_;
        fVar279 = auVar85._0_4_;
        fVar281 = auVar85._4_4_;
        fVar283 = auVar85._8_4_;
        fVar130 = auVar85._12_4_;
        fVar132 = auVar85._16_4_;
        fVar133 = auVar85._20_4_;
        fVar136 = auVar85._24_4_;
        fVar228 = auVar85._28_4_;
        fVar278 = auVar216._0_4_;
        switch(uVar18) {
        case 1:
          auVar110 = vmaxps_avx(auVar110,_DAT_005a71a0);
          break;
        case 2:
          auVar76 = vmaxps_avx(auVar110,ZEXT1632(ZEXT816(0) << 0x40));
          auVar160 = vminps_avx(auVar110,ZEXT1632(ZEXT816(0) << 0x40));
          fVar274 = *(this->super_InnerProduct).activation_params.data;
          auVar110._0_4_ = fVar274 * auVar160._0_4_ + auVar76._0_4_;
          auVar110._4_4_ = fVar274 * auVar160._4_4_ + auVar76._4_4_;
          auVar110._8_4_ = fVar274 * auVar160._8_4_ + auVar76._8_4_;
          auVar110._12_4_ = fVar274 * auVar160._12_4_ + auVar76._12_4_;
          auVar110._16_4_ = fVar274 * auVar160._16_4_ + auVar76._16_4_;
          auVar110._20_4_ = fVar274 * auVar160._20_4_ + auVar76._20_4_;
          auVar110._24_4_ = fVar274 * auVar160._24_4_ + auVar76._24_4_;
          auVar110._28_4_ = auVar160._28_4_ + auVar76._28_4_;
          break;
        case 3:
          puVar21 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar11 = *puVar21;
          auVar155._4_4_ = uVar11;
          auVar155._0_4_ = uVar11;
          auVar155._8_4_ = uVar11;
          auVar155._12_4_ = uVar11;
          auVar155._16_4_ = uVar11;
          auVar155._20_4_ = uVar11;
          auVar155._24_4_ = uVar11;
          auVar155._28_4_ = uVar11;
          uVar11 = puVar21[1];
          auVar194._4_4_ = uVar11;
          auVar194._0_4_ = uVar11;
          auVar194._8_4_ = uVar11;
          auVar194._12_4_ = uVar11;
          auVar194._16_4_ = uVar11;
          auVar194._20_4_ = uVar11;
          auVar194._24_4_ = uVar11;
          auVar194._28_4_ = uVar11;
          auVar76 = vmaxps_avx(auVar110,auVar155);
          auVar110 = vminps_avx(auVar76,auVar194);
          break;
        case 4:
          auVar111._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
          auVar111._8_4_ = -auVar110._8_4_;
          auVar111._12_4_ = -auVar110._12_4_;
          auVar111._16_4_ = -auVar110._16_4_;
          auVar111._20_4_ = -auVar110._20_4_;
          auVar111._24_4_ = -auVar110._24_4_;
          auVar111._28_4_ = -auVar110._28_4_;
          auVar156._8_4_ = 0x42b0c0a5;
          auVar156._0_8_ = 0x42b0c0a542b0c0a5;
          auVar156._12_4_ = 0x42b0c0a5;
          auVar156._16_4_ = 0x42b0c0a5;
          auVar156._20_4_ = 0x42b0c0a5;
          auVar156._24_4_ = 0x42b0c0a5;
          auVar156._28_4_ = 0x42b0c0a5;
          auVar110 = vminps_avx(auVar111,auVar156);
          auVar157._8_4_ = 0xc2b0c0a5;
          auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar157._12_4_ = 0xc2b0c0a5;
          auVar157._16_4_ = 0xc2b0c0a5;
          auVar157._20_4_ = 0xc2b0c0a5;
          auVar157._24_4_ = 0xc2b0c0a5;
          auVar157._28_4_ = 0xc2b0c0a5;
          auVar160 = vmaxps_avx(auVar110,auVar157);
          auVar158._0_4_ = auVar160._0_4_ * 1.442695 + fVar278;
          auVar158._4_4_ = auVar160._4_4_ * 1.442695 + fVar280;
          auVar158._8_4_ = auVar160._8_4_ * 1.442695 + fVar282;
          auVar158._12_4_ = auVar160._12_4_ * 1.442695 + fVar86;
          auVar158._16_4_ = auVar160._16_4_ * 1.442695 + fVar131;
          auVar158._20_4_ = auVar160._20_4_ * 1.442695 + fVar134;
          auVar158._24_4_ = auVar160._24_4_ * 1.442695 + fVar135;
          auVar158._28_4_ = fVar217 + 1.442695;
          auVar58 = vroundps_avx(auVar158,1);
          auVar110 = vcmpps_avx(auVar158,auVar58,1);
          auVar110 = vandps_avx(auVar110,auVar76);
          auVar110 = vsubps_avx(auVar58,auVar110);
          fVar274 = auVar160._0_4_ + auVar110._0_4_ * -0.6931472;
          fVar277 = auVar160._4_4_ + auVar110._4_4_ * -0.6931472;
          fVar217 = auVar160._8_4_ + auVar110._8_4_ * -0.6931472;
          fVar229 = auVar160._12_4_ + auVar110._12_4_ * -0.6931472;
          fVar230 = auVar160._16_4_ + auVar110._16_4_ * -0.6931472;
          fVar231 = auVar160._20_4_ + auVar110._20_4_ * -0.6931472;
          fVar232 = auVar160._24_4_ + auVar110._24_4_ * -0.6931472;
          auVar138._0_4_ = (int)auVar110._0_4_;
          auVar138._4_4_ = (int)auVar110._4_4_;
          auVar138._8_4_ = (int)auVar110._8_4_;
          auVar138._12_4_ = (int)auVar110._12_4_;
          auVar159._16_4_ = (int)auVar110._16_4_;
          auVar159._0_16_ = auVar138;
          auVar159._20_4_ = (int)auVar110._20_4_;
          auVar159._24_4_ = (int)auVar110._24_4_;
          auVar159._28_4_ = (int)auVar110._28_4_;
          auVar218 = vpslld_avx(auVar138,0x17);
          auVar175 = vpslld_avx(auVar159._16_16_,0x17);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar175 = vpaddd_avx(auVar175,auVar52);
          auVar218 = vpaddd_avx(auVar218,auVar52);
          auVar112._0_4_ =
               (fVar274 + fVar279 +
               fVar274 * fVar274 *
               (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
                 0.041665796) * fVar274 + 0.16666666) * fVar274 + fVar278)) * auVar218._0_4_ +
               fVar279;
          auVar112._4_4_ =
               (fVar277 + fVar281 +
               fVar277 * fVar277 *
               (((((fVar277 * 0.00019875691 + 0.0013981999) * fVar277 + 0.008333452) * fVar277 +
                 0.041665796) * fVar277 + 0.16666666) * fVar277 + fVar280)) * auVar218._4_4_ +
               fVar281;
          auVar112._8_4_ =
               (fVar217 + fVar283 +
               fVar217 * fVar217 *
               (((((fVar217 * 0.00019875691 + 0.0013981999) * fVar217 + 0.008333452) * fVar217 +
                 0.041665796) * fVar217 + 0.16666666) * fVar217 + fVar282)) * auVar218._8_4_ +
               fVar283;
          auVar112._12_4_ =
               (fVar229 + fVar130 +
               fVar229 * fVar229 *
               (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229 +
                 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar86)) * auVar218._12_4_ +
               fVar130;
          auVar112._16_4_ =
               (fVar230 + fVar132 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar131)) * auVar175._0_4_ +
               fVar132;
          auVar112._20_4_ =
               (fVar231 + fVar133 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + fVar134)) * auVar175._4_4_ +
               fVar133;
          auVar112._24_4_ =
               (fVar232 + fVar136 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + fVar135)) * auVar175._8_4_ +
               fVar136;
          auVar112._28_4_ = auVar160._28_4_ + -0.6931472 + fVar228 + -0.6931472 + fVar228;
          auVar110 = vdivps_avx(auVar76,auVar112);
          break;
        case 5:
          auVar266._8_4_ = 0x42b0c0a5;
          auVar266._0_8_ = 0x42b0c0a542b0c0a5;
          auVar266._12_4_ = 0x42b0c0a5;
          auVar266._16_4_ = 0x42b0c0a5;
          auVar266._20_4_ = 0x42b0c0a5;
          auVar266._24_4_ = 0x42b0c0a5;
          auVar266._28_4_ = 0x42b0c0a5;
          auVar160 = vminps_avx(auVar266,auVar110);
          auVar271._8_4_ = 0xc2b0c0a5;
          auVar271._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar271._12_4_ = 0xc2b0c0a5;
          auVar271._16_4_ = 0xc2b0c0a5;
          auVar271._20_4_ = 0xc2b0c0a5;
          auVar271._24_4_ = 0xc2b0c0a5;
          auVar271._28_4_ = 0xc2b0c0a5;
          auVar58 = vmaxps_avx(auVar271,auVar160);
          auVar186._0_4_ = auVar58._0_4_ * 1.442695 + fVar278;
          auVar186._4_4_ = auVar58._4_4_ * 1.442695 + fVar280;
          auVar186._8_4_ = auVar58._8_4_ * 1.442695 + fVar282;
          auVar186._12_4_ = auVar58._12_4_ * 1.442695 + fVar86;
          auVar186._16_4_ = auVar58._16_4_ * 1.442695 + fVar131;
          auVar186._20_4_ = auVar58._20_4_ * 1.442695 + fVar134;
          auVar186._24_4_ = auVar58._24_4_ * 1.442695 + fVar135;
          auVar186._28_4_ = fVar248 + fVar203 + fVar217;
          auVar188 = vroundps_avx(auVar186,1);
          auVar160 = vcmpps_avx(auVar186,auVar188,1);
          auVar160 = vandps_avx(auVar160,auVar76);
          auVar160 = vsubps_avx(auVar188,auVar160);
          auVar23._4_4_ = auVar160._4_4_ * 0.6931472;
          auVar23._0_4_ = auVar160._0_4_ * 0.6931472;
          auVar23._8_4_ = auVar160._8_4_ * 0.6931472;
          auVar23._12_4_ = auVar160._12_4_ * 0.6931472;
          auVar23._16_4_ = auVar160._16_4_ * 0.6931472;
          auVar23._20_4_ = auVar160._20_4_ * 0.6931472;
          auVar23._24_4_ = auVar160._24_4_ * 0.6931472;
          auVar23._28_4_ = auVar188._28_4_;
          auVar58 = vsubps_avx(auVar58,auVar23);
          fVar229 = auVar58._0_4_;
          fVar230 = auVar58._4_4_;
          fVar231 = auVar58._8_4_;
          fVar232 = auVar58._12_4_;
          fVar233 = auVar58._16_4_;
          fVar234 = auVar58._20_4_;
          fVar284 = auVar58._24_4_;
          auVar174._0_4_ = (int)auVar160._0_4_;
          auVar174._4_4_ = (int)auVar160._4_4_;
          auVar174._8_4_ = (int)auVar160._8_4_;
          auVar174._12_4_ = (int)auVar160._12_4_;
          auVar187._16_4_ = (int)auVar160._16_4_;
          auVar187._0_16_ = auVar174;
          auVar187._20_4_ = (int)auVar160._20_4_;
          auVar187._24_4_ = (int)auVar160._24_4_;
          auVar187._28_4_ = (int)auVar160._28_4_;
          auVar218 = vpslld_avx(auVar174,0x17);
          auVar175 = vpslld_avx(auVar187._16_16_,0x17);
          auVar204._8_4_ = 0x3f800000;
          auVar204._0_8_ = 0x3f8000003f800000;
          auVar204._12_4_ = 0x3f800000;
          auVar175 = vpaddd_avx(auVar175,auVar204);
          auVar218 = vpaddd_avx(auVar218,auVar204);
          auVar153._0_4_ =
               (fVar229 + fVar279 +
               (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229 +
                 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar278) * fVar229 * fVar229) *
               auVar218._0_4_ + fVar279;
          auVar153._4_4_ =
               (fVar230 + fVar281 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar280) * fVar230 * fVar230) *
               auVar218._4_4_ + fVar281;
          auVar153._8_4_ =
               (fVar231 + fVar283 +
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + fVar282) * fVar231 * fVar231) *
               auVar218._8_4_ + fVar283;
          auVar153._12_4_ =
               (fVar232 + fVar130 +
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + fVar86) * fVar232 * fVar232) *
               auVar218._12_4_ + fVar130;
          auVar153._16_4_ =
               (fVar233 + fVar132 +
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + fVar131) * fVar233 * fVar233) *
               auVar175._0_4_ + fVar132;
          auVar153._20_4_ =
               (fVar234 + fVar133 +
               (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                 0.041665796) * fVar234 + 0.16666666) * fVar234 + fVar134) * fVar234 * fVar234) *
               auVar175._4_4_ + fVar133;
          auVar153._24_4_ =
               (fVar284 + fVar136 +
               (((((fVar284 * 0.00019875691 + 0.0013981999) * fVar284 + 0.008333452) * fVar284 +
                 0.041665796) * fVar284 + 0.16666666) * fVar284 + fVar135) * fVar284 * fVar284) *
               auVar175._8_4_ + fVar136;
          auVar153._28_4_ = auVar58._28_4_ + fVar228 + auVar188._28_4_ + fVar228;
          auVar188._8_4_ = 0x800000;
          auVar188._0_8_ = 0x80000000800000;
          auVar188._12_4_ = 0x800000;
          auVar188._16_4_ = 0x800000;
          auVar188._20_4_ = 0x800000;
          auVar188._24_4_ = 0x800000;
          auVar188._28_4_ = 0x800000;
          auVar188 = vmaxps_avx(auVar153,auVar188);
          auVar175 = vpsrld_avx(auVar188._16_16_,0x17);
          auVar189._8_4_ = 0x807fffff;
          auVar189._0_8_ = 0x807fffff807fffff;
          auVar189._12_4_ = 0x807fffff;
          auVar189._16_4_ = 0x807fffff;
          auVar189._20_4_ = 0x807fffff;
          auVar189._24_4_ = 0x807fffff;
          auVar189._28_4_ = 0x807fffff;
          auVar160 = vandps_avx(auVar188,auVar189);
          auVar23 = vorps_avx(auVar160,auVar216._0_32_);
          auVar214._8_4_ = 0x3f3504f3;
          auVar214._0_8_ = 0x3f3504f33f3504f3;
          auVar214._12_4_ = 0x3f3504f3;
          auVar214._16_4_ = 0x3f3504f3;
          auVar214._20_4_ = 0x3f3504f3;
          auVar214._24_4_ = 0x3f3504f3;
          auVar214._28_4_ = 0x3f3504f3;
          auVar58 = vcmpps_avx(auVar214,auVar23,2);
          auVar160 = vandnps_avx(auVar58,auVar23);
          fVar229 = auVar160._0_4_ + auVar23._0_4_ + -1.0;
          fVar230 = auVar160._4_4_ + auVar23._4_4_ + -1.0;
          fVar231 = auVar160._8_4_ + auVar23._8_4_ + -1.0;
          fVar232 = auVar160._12_4_ + auVar23._12_4_ + -1.0;
          fVar233 = auVar160._16_4_ + auVar23._16_4_ + -1.0;
          fVar234 = auVar160._20_4_ + auVar23._20_4_ + -1.0;
          fVar284 = auVar160._24_4_ + auVar23._24_4_ + -1.0;
          auVar175 = vpsubd_avx(auVar175,auVar58._16_16_);
          auVar218 = vpsrld_avx(auVar188._0_16_,0x17);
          auVar210._8_4_ = 0xffffff81;
          auVar210._0_8_ = 0xffffff81ffffff81;
          auVar210._12_4_ = 0xffffff81;
          auVar175 = vpaddd_avx(auVar175,auVar210);
          auVar218 = vpsubd_avx(auVar218,auVar58._0_16_);
          auVar218 = vpaddd_avx(auVar218,auVar210);
          auVar223._16_16_ = auVar175;
          auVar223._0_16_ = auVar218;
          auVar58 = vcmpps_avx(auVar153,_DAT_005a71a0,2);
          auVar188 = vcvtdq2ps_avx(auVar223);
          auVar24._4_4_ =
               (fVar230 * fVar230 *
                (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) * fVar230 +
                      -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057) * fVar230 +
                   0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) * fVar230 + -0.5) +
               auVar188._4_4_ * 0.6931472 + fVar230) * -2.0;
          auVar24._0_4_ =
               (fVar229 * fVar229 *
                (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) * fVar229 +
                      -0.12420141) * fVar229 + 0.14249323) * fVar229 + -0.16668057) * fVar229 +
                   0.20000714) * fVar229 + -0.24999994) * fVar229 + 0.3333333) * fVar229 + -0.5) +
               auVar188._0_4_ * 0.6931472 + fVar229) * -2.0;
          auVar24._8_4_ =
               (fVar231 * fVar231 *
                (((((((((fVar231 * 0.070376836 + -0.1151461) * fVar231 + 0.116769984) * fVar231 +
                      -0.12420141) * fVar231 + 0.14249323) * fVar231 + -0.16668057) * fVar231 +
                   0.20000714) * fVar231 + -0.24999994) * fVar231 + 0.3333333) * fVar231 + -0.5) +
               auVar188._8_4_ * 0.6931472 + fVar231) * -2.0;
          auVar24._12_4_ =
               (fVar232 * fVar232 *
                (((((((((fVar232 * 0.070376836 + -0.1151461) * fVar232 + 0.116769984) * fVar232 +
                      -0.12420141) * fVar232 + 0.14249323) * fVar232 + -0.16668057) * fVar232 +
                   0.20000714) * fVar232 + -0.24999994) * fVar232 + 0.3333333) * fVar232 + -0.5) +
               auVar188._12_4_ * 0.6931472 + fVar232) * -2.0;
          auVar24._16_4_ =
               (fVar233 * fVar233 *
                (((((((((fVar233 * 0.070376836 + -0.1151461) * fVar233 + 0.116769984) * fVar233 +
                      -0.12420141) * fVar233 + 0.14249323) * fVar233 + -0.16668057) * fVar233 +
                   0.20000714) * fVar233 + -0.24999994) * fVar233 + 0.3333333) * fVar233 + -0.5) +
               auVar188._16_4_ * 0.6931472 + fVar233) * -2.0;
          auVar24._20_4_ =
               (fVar234 * fVar234 *
                (((((((((fVar234 * 0.070376836 + -0.1151461) * fVar234 + 0.116769984) * fVar234 +
                      -0.12420141) * fVar234 + 0.14249323) * fVar234 + -0.16668057) * fVar234 +
                   0.20000714) * fVar234 + -0.24999994) * fVar234 + 0.3333333) * fVar234 + -0.5) +
               auVar188._20_4_ * 0.6931472 + fVar234) * -2.0;
          auVar24._24_4_ =
               (fVar284 * fVar284 *
                (((((((((fVar284 * 0.070376836 + -0.1151461) * fVar284 + 0.116769984) * fVar284 +
                      -0.12420141) * fVar284 + 0.14249323) * fVar284 + -0.16668057) * fVar284 +
                   0.20000714) * fVar284 + -0.24999994) * fVar284 + 0.3333333) * fVar284 + -0.5) +
               auVar188._24_4_ * 0.6931472 + fVar284) * -2.0;
          auVar24._28_4_ = auVar188._28_4_ + auVar160._28_4_ + auVar23._28_4_ + -1.0 + 0.0;
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar215._16_4_ = 0x7fffffff;
          auVar215._20_4_ = 0x7fffffff;
          auVar215._24_4_ = 0x7fffffff;
          auVar215._28_4_ = 0x7fffffff;
          auVar160 = vblendvps_avx(auVar24,auVar215,auVar58);
          auVar190._8_4_ = 0x42b0c0a5;
          auVar190._0_8_ = 0x42b0c0a542b0c0a5;
          auVar190._12_4_ = 0x42b0c0a5;
          auVar190._16_4_ = 0x42b0c0a5;
          auVar190._20_4_ = 0x42b0c0a5;
          auVar190._24_4_ = 0x42b0c0a5;
          auVar190._28_4_ = 0x42b0c0a5;
          auVar160 = vminps_avx(auVar160,auVar190);
          auVar191._8_4_ = 0xc2b0c0a5;
          auVar191._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar191._12_4_ = 0xc2b0c0a5;
          auVar191._16_4_ = 0xc2b0c0a5;
          auVar191._20_4_ = 0xc2b0c0a5;
          auVar191._24_4_ = 0xc2b0c0a5;
          auVar191._28_4_ = 0xc2b0c0a5;
          auVar58 = vmaxps_avx(auVar160,auVar191);
          auVar192._0_4_ = auVar58._0_4_ * 1.442695 + fVar278;
          auVar192._4_4_ = auVar58._4_4_ * 1.442695 + fVar280;
          auVar192._8_4_ = auVar58._8_4_ * 1.442695 + fVar282;
          auVar192._12_4_ = auVar58._12_4_ * 1.442695 + fVar86;
          auVar192._16_4_ = auVar58._16_4_ * 1.442695 + fVar131;
          auVar192._20_4_ = auVar58._20_4_ * 1.442695 + fVar134;
          auVar192._24_4_ = auVar58._24_4_ * 1.442695 + fVar135;
          auVar192._28_4_ = fVar217 + 1.442695;
          auVar188 = vroundps_avx(auVar192,1);
          auVar160 = vcmpps_avx(auVar192,auVar188,1);
          auVar160 = vandps_avx(auVar160,auVar76);
          auVar160 = vsubps_avx(auVar188,auVar160);
          auVar25._4_4_ = auVar160._4_4_ * 0.6931472;
          auVar25._0_4_ = auVar160._0_4_ * 0.6931472;
          auVar25._8_4_ = auVar160._8_4_ * 0.6931472;
          auVar25._12_4_ = auVar160._12_4_ * 0.6931472;
          auVar25._16_4_ = auVar160._16_4_ * 0.6931472;
          auVar25._20_4_ = auVar160._20_4_ * 0.6931472;
          auVar25._24_4_ = auVar160._24_4_ * 0.6931472;
          auVar25._28_4_ = auVar188._28_4_;
          auVar58 = vsubps_avx(auVar58,auVar25);
          fVar217 = auVar58._0_4_;
          fVar229 = auVar58._4_4_;
          fVar230 = auVar58._8_4_;
          fVar231 = auVar58._12_4_;
          fVar232 = auVar58._16_4_;
          fVar233 = auVar58._20_4_;
          fVar234 = auVar58._24_4_;
          auVar216 = ZEXT3264(auVar216._0_32_);
          auVar85 = ZEXT3264(auVar76);
          auVar176._0_4_ = (int)auVar160._0_4_;
          auVar176._4_4_ = (int)auVar160._4_4_;
          auVar176._8_4_ = (int)auVar160._8_4_;
          auVar176._12_4_ = (int)auVar160._12_4_;
          auVar193._16_4_ = (int)auVar160._16_4_;
          auVar193._0_16_ = auVar176;
          auVar193._20_4_ = (int)auVar160._20_4_;
          auVar193._24_4_ = (int)auVar160._24_4_;
          auVar193._28_4_ = (int)auVar160._28_4_;
          auVar218 = vpslld_avx(auVar176,0x17);
          auVar175 = vpslld_avx(auVar193._16_16_,0x17);
          auVar175 = vpaddd_avx(auVar175,auVar204);
          auVar218 = vpaddd_avx(auVar218,auVar204);
          auVar154._0_4_ =
               (fVar217 + fVar279 +
               (((((fVar217 * 0.00019875691 + 0.0013981999) * fVar217 + 0.008333452) * fVar217 +
                 0.041665796) * fVar217 + 0.16666666) * fVar217 + fVar278) * fVar217 * fVar217) *
               auVar218._0_4_ + fVar279;
          auVar154._4_4_ =
               (fVar229 + fVar281 +
               (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229 +
                 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar280) * fVar229 * fVar229) *
               auVar218._4_4_ + fVar281;
          auVar154._8_4_ =
               (fVar230 + fVar283 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar282) * fVar230 * fVar230) *
               auVar218._8_4_ + fVar283;
          auVar154._12_4_ =
               (fVar231 + fVar130 +
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + fVar86) * fVar231 * fVar231) *
               auVar218._12_4_ + fVar130;
          auVar154._16_4_ =
               (fVar232 + fVar132 +
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + fVar131) * fVar232 * fVar232) *
               auVar175._0_4_ + fVar132;
          auVar154._20_4_ =
               (fVar233 + fVar133 +
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + fVar134) * fVar233 * fVar233) *
               auVar175._4_4_ + fVar133;
          auVar154._24_4_ =
               (fVar234 + fVar136 +
               (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                 0.041665796) * fVar234 + 0.16666666) * fVar234 + fVar135) * fVar234 * fVar234) *
               auVar175._8_4_ + fVar136;
          auVar154._28_4_ = auVar58._28_4_ + fVar228 + auVar188._28_4_ + fVar228;
          auVar58._8_4_ = 0x40000000;
          auVar58._0_8_ = 0x4000000040000000;
          auVar58._12_4_ = 0x40000000;
          auVar58._16_4_ = 0x40000000;
          auVar58._20_4_ = 0x40000000;
          auVar58._24_4_ = 0x40000000;
          auVar58._28_4_ = 0x40000000;
          auVar76 = vdivps_avx(auVar58,auVar154);
          auVar152._0_4_ = auVar76._0_4_ + -1.0;
          auVar152._4_4_ = auVar76._4_4_ + -1.0;
          auVar152._8_4_ = auVar76._8_4_ + -1.0;
          auVar152._12_4_ = auVar76._12_4_ + -1.0;
          auVar152._16_4_ = auVar76._16_4_ + -1.0;
          auVar152._20_4_ = auVar76._20_4_ + -1.0;
          auVar152._24_4_ = auVar76._24_4_ + -1.0;
          goto LAB_002fa6da;
        case 6:
          pfVar40 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar278 = *pfVar40;
          fVar279 = pfVar40[1];
          auVar160._0_4_ = fVar278 * fVar274 + fVar279;
          auVar160._4_4_ = fVar278 * fVar277 + fVar279;
          auVar160._8_4_ = fVar278 * auVar110._8_4_ + fVar279;
          auVar160._12_4_ = fVar278 * auVar110._12_4_ + fVar279;
          auVar160._16_4_ = fVar278 * auVar110._16_4_ + fVar279;
          auVar160._20_4_ = fVar278 * auVar110._20_4_ + fVar279;
          auVar160._24_4_ = fVar278 * auVar110._24_4_ + fVar279;
          auVar160._28_4_ = fVar278 + fVar279;
          auVar160 = vmaxps_avx(auVar160,_DAT_005a71a0);
          auVar76 = vminps_avx(auVar160,auVar76);
          auVar152 = auVar76._0_28_;
LAB_002fa6da:
          auVar110._4_4_ = auVar152._4_4_ * fVar277;
          auVar110._0_4_ = auVar152._0_4_ * fVar274;
          auVar110._8_4_ = auVar152._8_4_ * auVar110._8_4_;
          auVar110._12_4_ = auVar152._12_4_ * auVar110._12_4_;
          auVar110._16_4_ = auVar152._16_4_ * auVar110._16_4_;
          auVar110._20_4_ = auVar152._20_4_ * auVar110._20_4_;
          auVar110._24_4_ = auVar152._24_4_ * auVar110._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar35 * 0x20) = auVar110;
        uVar35 = uVar35 + 1;
      } while (uVar35 != uVar38);
    }
    goto LAB_002fad00;
  }
  local_d0 = (ulong)(int)uVar38;
  lVar44 = (long)(int)uVar50;
  if (0 < (int)uVar38 >> 3) {
    local_88 = (ulong)(uint)((int)uVar38 >> 3);
    lVar36 = lVar44 * 0x1c;
    local_90 = lVar44 * 0x20;
    lVar51 = lVar44 * 8;
    lVar41 = lVar44 * 0x18;
    local_b0 = lVar44 * 4;
    local_b8 = lVar44 * 0xc;
    local_c0 = 0;
    auVar85 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar216 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar46 = lVar44 * 0x14;
    lVar49 = lVar44 << 4;
    uVar35 = 0;
    do {
      local_a8 = uVar35;
      local_a0 = lVar49;
      local_98 = lVar46;
      uVar35 = local_a8 * 8;
      fVar278 = 0.0;
      fVar279 = 0.0;
      fVar274 = 0.0;
      fVar277 = 0.0;
      fVar280 = 0.0;
      fVar281 = 0.0;
      fVar282 = 0.0;
      fVar283 = 0.0;
      if (pvVar20 != (void *)0x0) {
        pfVar40 = (float *)((long)pvVar20 + local_a8 * 0x20);
        fVar274 = *pfVar40;
        fVar277 = pfVar40[1];
        fVar278 = pfVar40[2];
        fVar279 = pfVar40[3];
        fVar280 = pfVar40[4];
        fVar281 = pfVar40[5];
        fVar282 = pfVar40[6];
        fVar283 = pfVar40[7];
      }
      pvVar39 = (this->weight_data_tm).data;
      local_e8._0_8_ = lVar51;
      if ((int)uVar50 < 8) {
        uVar34 = 0;
        lVar46 = uVar35 * lVar44 * 4;
        lVar49 = (uVar35 | 1) * lVar44 * 4;
        lVar1 = (uVar35 | 2) * lVar44 * 4;
        lVar2 = (uVar35 | 3) * lVar44 * 4;
        lVar3 = (uVar35 | 4) * lVar44 * 4;
        lVar4 = (uVar35 | 5) * lVar44 * 4;
        lVar5 = (uVar35 | 6) * lVar44 * 4;
        lVar6 = (uVar35 | 7) * lVar44 * 4;
        in_ZMM6 = ZEXT864(0);
        auVar77 = ZEXT832(0);
        auVar113 = ZEXT832(0);
        auVar161 = SUB6432(ZEXT864(0),0);
        auVar224 = ZEXT832(0);
        auVar240 = SUB6432(ZEXT864(0),0);
        auVar251 = ZEXT832(0);
        auVar285 = SUB6432(ZEXT864(0),0);
        pfVar40 = (float *)local_138._0_8_;
      }
      else {
        auVar286 = ZEXT864(0);
        iVar31 = 7;
        lVar48 = 0;
        auVar253 = ZEXT864(0);
        auVar241 = ZEXT864(0);
        auVar227 = ZEXT864(0);
        auVar165 = ZEXT864(0);
        auVar129 = ZEXT864(0);
        auVar268 = ZEXT864(0);
        in_ZMM6 = ZEXT864(0);
        do {
          pfVar37 = (float *)(local_138._0_8_ + lVar48);
          fVar86 = *pfVar37;
          fVar130 = pfVar37[1];
          fVar131 = pfVar37[2];
          fVar132 = pfVar37[3];
          fVar133 = pfVar37[4];
          fVar134 = pfVar37[5];
          fVar135 = pfVar37[6];
          pfVar40 = (float *)((long)pvVar39 + lVar48 + local_c0);
          auVar285._0_4_ = fVar86 * *pfVar40 + auVar286._0_4_;
          auVar285._4_4_ = fVar130 * pfVar40[1] + auVar286._4_4_;
          auVar285._8_4_ = fVar131 * pfVar40[2] + auVar286._8_4_;
          auVar285._12_4_ = fVar132 * pfVar40[3] + auVar286._12_4_;
          auVar285._16_4_ = fVar133 * pfVar40[4] + auVar286._16_4_;
          auVar285._20_4_ = fVar134 * pfVar40[5] + auVar286._20_4_;
          auVar285._24_4_ = fVar135 * pfVar40[6] + auVar286._24_4_;
          fVar136 = in_ZMM11._28_4_;
          auVar285._28_4_ = fVar136 + auVar286._28_4_;
          auVar286 = ZEXT3264(auVar285);
          pfVar40 = (float *)((long)pvVar39 + lVar48 + local_b0);
          pfVar33 = (float *)((long)pvVar39 + lVar48 + lVar51);
          auVar251._0_4_ = fVar86 * *pfVar40 + auVar253._0_4_;
          auVar251._4_4_ = fVar130 * pfVar40[1] + auVar253._4_4_;
          auVar251._8_4_ = fVar131 * pfVar40[2] + auVar253._8_4_;
          auVar251._12_4_ = fVar132 * pfVar40[3] + auVar253._12_4_;
          auVar251._16_4_ = fVar133 * pfVar40[4] + auVar253._16_4_;
          auVar251._20_4_ = fVar134 * pfVar40[5] + auVar253._20_4_;
          auVar251._24_4_ = fVar135 * pfVar40[6] + auVar253._24_4_;
          auVar251._28_4_ = fVar136 + auVar253._28_4_;
          auVar253 = ZEXT3264(auVar251);
          auVar240._0_4_ = fVar86 * *pfVar33 + auVar241._0_4_;
          auVar240._4_4_ = fVar130 * pfVar33[1] + auVar241._4_4_;
          auVar240._8_4_ = fVar131 * pfVar33[2] + auVar241._8_4_;
          auVar240._12_4_ = fVar132 * pfVar33[3] + auVar241._12_4_;
          auVar240._16_4_ = fVar133 * pfVar33[4] + auVar241._16_4_;
          auVar240._20_4_ = fVar134 * pfVar33[5] + auVar241._20_4_;
          auVar240._24_4_ = fVar135 * pfVar33[6] + auVar241._24_4_;
          fVar217 = in_ZMM12._28_4_;
          auVar240._28_4_ = fVar217 + auVar241._28_4_;
          auVar241 = ZEXT3264(auVar240);
          pfVar40 = (float *)((long)pvVar39 + lVar48 + local_b8);
          auVar224._0_4_ = fVar86 * *pfVar40 + auVar227._0_4_;
          auVar224._4_4_ = fVar130 * pfVar40[1] + auVar227._4_4_;
          auVar224._8_4_ = fVar131 * pfVar40[2] + auVar227._8_4_;
          auVar224._12_4_ = fVar132 * pfVar40[3] + auVar227._12_4_;
          auVar224._16_4_ = fVar133 * pfVar40[4] + auVar227._16_4_;
          auVar224._20_4_ = fVar134 * pfVar40[5] + auVar227._20_4_;
          auVar224._24_4_ = fVar135 * pfVar40[6] + auVar227._24_4_;
          auVar224._28_4_ = fVar136 + auVar227._28_4_;
          auVar227 = ZEXT3264(auVar224);
          pfVar40 = (float *)((long)pvVar39 + lVar48 + local_a0);
          auVar161._0_4_ = fVar86 * *pfVar40 + auVar165._0_4_;
          auVar161._4_4_ = fVar130 * pfVar40[1] + auVar165._4_4_;
          auVar161._8_4_ = fVar131 * pfVar40[2] + auVar165._8_4_;
          auVar161._12_4_ = fVar132 * pfVar40[3] + auVar165._12_4_;
          auVar161._16_4_ = fVar133 * pfVar40[4] + auVar165._16_4_;
          auVar161._20_4_ = fVar134 * pfVar40[5] + auVar165._20_4_;
          auVar161._24_4_ = fVar135 * pfVar40[6] + auVar165._24_4_;
          auVar161._28_4_ = fVar136 + auVar165._28_4_;
          auVar165 = ZEXT3264(auVar161);
          pfVar40 = (float *)((long)pvVar39 + lVar48 + local_98);
          in_ZMM11 = ZEXT3264(CONCAT428(fVar136,CONCAT424(fVar135 * pfVar40[6],
                                                          CONCAT420(fVar134 * pfVar40[5],
                                                                    CONCAT416(fVar133 * pfVar40[4],
                                                                              CONCAT412(fVar132 * 
                                                  pfVar40[3],
                                                  CONCAT48(fVar131 * pfVar40[2],
                                                           CONCAT44(fVar130 * pfVar40[1],
                                                                    fVar86 * *pfVar40))))))));
          pfVar33 = (float *)((long)pvVar39 + lVar48 + lVar41);
          in_ZMM12 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar135 * pfVar33[6],
                                                          CONCAT420(fVar134 * pfVar33[5],
                                                                    CONCAT416(fVar133 * pfVar33[4],
                                                                              CONCAT412(fVar132 * 
                                                  pfVar33[3],
                                                  CONCAT48(fVar131 * pfVar33[2],
                                                           CONCAT44(fVar130 * pfVar33[1],
                                                                    fVar86 * *pfVar33))))))));
          auVar113._0_4_ = fVar86 * *pfVar40 + auVar129._0_4_;
          auVar113._4_4_ = fVar130 * pfVar40[1] + auVar129._4_4_;
          auVar113._8_4_ = fVar131 * pfVar40[2] + auVar129._8_4_;
          auVar113._12_4_ = fVar132 * pfVar40[3] + auVar129._12_4_;
          auVar113._16_4_ = fVar133 * pfVar40[4] + auVar129._16_4_;
          auVar113._20_4_ = fVar134 * pfVar40[5] + auVar129._20_4_;
          auVar113._24_4_ = fVar135 * pfVar40[6] + auVar129._24_4_;
          auVar113._28_4_ = fVar136 + auVar129._28_4_;
          auVar129 = ZEXT3264(auVar113);
          auVar77._0_4_ = fVar86 * *pfVar33 + auVar268._0_4_;
          auVar77._4_4_ = fVar130 * pfVar33[1] + auVar268._4_4_;
          auVar77._8_4_ = fVar131 * pfVar33[2] + auVar268._8_4_;
          auVar77._12_4_ = fVar132 * pfVar33[3] + auVar268._12_4_;
          auVar77._16_4_ = fVar133 * pfVar33[4] + auVar268._16_4_;
          auVar77._20_4_ = fVar134 * pfVar33[5] + auVar268._20_4_;
          auVar77._24_4_ = fVar135 * pfVar33[6] + auVar268._24_4_;
          auVar77._28_4_ = fVar217 + auVar268._28_4_;
          auVar268 = ZEXT3264(auVar77);
          pfVar40 = (float *)((long)pvVar39 + lVar48 + lVar36);
          in_ZMM6 = ZEXT3264(CONCAT428(pfVar37[7] + in_ZMM6._28_4_,
                                       CONCAT424(fVar135 * pfVar40[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar134 * pfVar40[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar133 * pfVar40[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar132 * pfVar40[3]
                                                                               + in_ZMM6._12_4_,
                                                                               CONCAT48(fVar131 * 
                                                  pfVar40[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar130 * pfVar40[1] + in_ZMM6._4_4_,
                                                           fVar86 * *pfVar40 + in_ZMM6._0_4_))))))))
          ;
          iVar31 = iVar31 + 8;
          lVar48 = lVar48 + 0x20;
        } while (iVar31 < (int)uVar50);
        lVar6 = lVar48 + lVar36;
        lVar5 = lVar48 + lVar41;
        lVar4 = lVar48 + local_98;
        lVar3 = lVar48 + local_a0;
        lVar2 = lVar48 + local_b8;
        lVar1 = lVar48 + lVar51;
        lVar49 = lVar48 + local_b0;
        lVar46 = lVar48 + local_c0;
        pfVar40 = (float *)(local_138._0_8_ + lVar48);
        uVar34 = uVar50 & 0xfffffff8;
      }
      if (uVar50 - uVar34 != 0 && (int)uVar34 <= (int)uVar50) {
        lVar48 = 0;
        do {
          auVar175 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar3)),
                                   ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar4)),0x10);
          auVar175 = vinsertps_avx(auVar175,ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar5)),
                                   0x20);
          auVar175 = vinsertps_avx(auVar175,ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar6)),
                                   0x30);
          auVar218 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar46)),
                                   ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar49)),0x10);
          auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar1)),
                                   0x20);
          auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)((long)pvVar39 + lVar48 * 4 + lVar2)),
                                   0x30);
          fVar86 = pfVar40[lVar48];
          in_ZMM11 = ZEXT3264(CONCAT428(fVar86,CONCAT424(fVar86,CONCAT420(fVar86,CONCAT416(fVar86,
                                                  CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,
                                                  fVar86))))))));
          fVar274 = auVar218._0_4_ * fVar86 + fVar274;
          fVar277 = auVar218._4_4_ * fVar86 + fVar277;
          fVar278 = auVar218._8_4_ * fVar86 + fVar278;
          fVar279 = auVar218._12_4_ * fVar86 + fVar279;
          fVar280 = auVar175._0_4_ * fVar86 + fVar280;
          fVar281 = auVar175._4_4_ * fVar86 + fVar281;
          fVar282 = auVar175._8_4_ * fVar86 + fVar282;
          fVar283 = auVar175._12_4_ + fVar283;
          lVar48 = lVar48 + 1;
        } while (uVar50 - uVar34 != (int)lVar48);
      }
      auVar76 = vhaddps_avx(auVar285,auVar251);
      auVar110 = vhaddps_avx(auVar240,auVar224);
      auVar110 = vhaddps_avx(auVar76,auVar110);
      in_ZMM7 = ZEXT3264(auVar110);
      auVar76 = vhaddps_avx(auVar161,auVar113);
      auVar160 = vhaddps_avx(auVar77,in_ZMM6._0_32_);
      auVar160 = vhaddps_avx(auVar76,auVar160);
      auVar76 = vblendps_avx(auVar110,auVar160,0xf0);
      auVar110 = vperm2f128_avx(auVar110,auVar160,0x21);
      auVar273._0_4_ = fVar274 + auVar110._0_4_ + auVar76._0_4_;
      auVar273._4_4_ = fVar277 + auVar110._4_4_ + auVar76._4_4_;
      auVar273._8_4_ = fVar278 + auVar110._8_4_ + auVar76._8_4_;
      auVar273._12_4_ = fVar279 + auVar110._12_4_ + auVar76._12_4_;
      auVar273._16_4_ = fVar280 + auVar110._16_4_ + auVar76._16_4_;
      auVar273._20_4_ = fVar281 + auVar110._20_4_ + auVar76._20_4_;
      auVar273._24_4_ = fVar282 + auVar110._24_4_ + auVar76._24_4_;
      auVar273._28_4_ = fVar283 + auVar110._28_4_ + auVar76._28_4_;
      auVar160 = auVar216._0_32_;
      auVar110 = auVar85._0_32_;
      fVar274 = auVar85._0_4_;
      fVar277 = auVar85._4_4_;
      fVar278 = auVar85._8_4_;
      fVar279 = auVar85._12_4_;
      fVar280 = auVar85._16_4_;
      fVar281 = auVar85._20_4_;
      fVar282 = auVar85._24_4_;
      fVar283 = auVar85._28_4_;
      switch(uVar18) {
      case 1:
        auVar273 = vmaxps_avx(auVar273,auVar160);
        break;
      case 2:
        auVar76 = vmaxps_avx(auVar273,auVar160);
        auVar110 = vminps_avx(auVar273,auVar160);
        fVar274 = *(this->super_InnerProduct).activation_params.data;
        auVar273._0_4_ = fVar274 * auVar110._0_4_ + auVar76._0_4_;
        auVar273._4_4_ = fVar274 * auVar110._4_4_ + auVar76._4_4_;
        auVar273._8_4_ = fVar274 * auVar110._8_4_ + auVar76._8_4_;
        auVar273._12_4_ = fVar274 * auVar110._12_4_ + auVar76._12_4_;
        auVar273._16_4_ = fVar274 * auVar110._16_4_ + auVar76._16_4_;
        auVar273._20_4_ = fVar274 * auVar110._20_4_ + auVar76._20_4_;
        auVar273._24_4_ = fVar274 * auVar110._24_4_ + auVar76._24_4_;
        auVar273._28_4_ = auVar110._28_4_ + auVar76._28_4_;
        break;
      case 3:
        puVar21 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar11 = *puVar21;
        auVar80._4_4_ = uVar11;
        auVar80._0_4_ = uVar11;
        auVar80._8_4_ = uVar11;
        auVar80._12_4_ = uVar11;
        auVar80._16_4_ = uVar11;
        auVar80._20_4_ = uVar11;
        auVar80._24_4_ = uVar11;
        auVar80._28_4_ = uVar11;
        uVar11 = puVar21[1];
        auVar122._4_4_ = uVar11;
        auVar122._0_4_ = uVar11;
        auVar122._8_4_ = uVar11;
        auVar122._12_4_ = uVar11;
        auVar122._16_4_ = uVar11;
        auVar122._20_4_ = uVar11;
        auVar122._24_4_ = uVar11;
        auVar122._28_4_ = uVar11;
        auVar76 = vmaxps_avx(auVar273,auVar80);
        auVar273 = vminps_avx(auVar76,auVar122);
        break;
      case 4:
        uVar35 = CONCAT44(auVar273._4_4_,auVar273._0_4_);
        auVar81._0_8_ = uVar35 ^ 0x8000000080000000;
        auVar81._8_4_ = -auVar273._8_4_;
        auVar81._12_4_ = -auVar273._12_4_;
        auVar81._16_4_ = -auVar273._16_4_;
        auVar81._20_4_ = -auVar273._20_4_;
        auVar81._24_4_ = -auVar273._24_4_;
        auVar81._28_4_ = -auVar273._28_4_;
        auVar123._8_4_ = 0x42b0c0a5;
        auVar123._0_8_ = 0x42b0c0a542b0c0a5;
        auVar123._12_4_ = 0x42b0c0a5;
        auVar123._16_4_ = 0x42b0c0a5;
        auVar123._20_4_ = 0x42b0c0a5;
        auVar123._24_4_ = 0x42b0c0a5;
        auVar123._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar81,auVar123);
        auVar124._8_4_ = 0xc2b0c0a5;
        auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar124._12_4_ = 0xc2b0c0a5;
        auVar124._16_4_ = 0xc2b0c0a5;
        auVar124._20_4_ = 0xc2b0c0a5;
        auVar124._24_4_ = 0xc2b0c0a5;
        auVar124._28_4_ = 0xc2b0c0a5;
        auVar160 = vmaxps_avx(auVar76,auVar124);
        auVar125._0_4_ = auVar160._0_4_ * 1.442695 + 0.5;
        auVar125._4_4_ = auVar160._4_4_ * 1.442695 + 0.5;
        auVar125._8_4_ = auVar160._8_4_ * 1.442695 + 0.5;
        auVar125._12_4_ = auVar160._12_4_ * 1.442695 + 0.5;
        auVar125._16_4_ = auVar160._16_4_ * 1.442695 + 0.5;
        auVar125._20_4_ = auVar160._20_4_ * 1.442695 + 0.5;
        auVar125._24_4_ = auVar160._24_4_ * 1.442695 + 0.5;
        auVar125._28_4_ = 0x3ff8aa3b;
        auVar58 = vroundps_avx(auVar125,1);
        auVar76 = vcmpps_avx(auVar125,auVar58,1);
        auVar76 = vandps_avx(auVar76,auVar110);
        auVar76 = vsubps_avx(auVar58,auVar76);
        fVar86 = auVar160._0_4_ + auVar76._0_4_ * -0.6931472;
        fVar130 = auVar160._4_4_ + auVar76._4_4_ * -0.6931472;
        fVar131 = auVar160._8_4_ + auVar76._8_4_ * -0.6931472;
        fVar132 = auVar160._12_4_ + auVar76._12_4_ * -0.6931472;
        fVar133 = auVar160._16_4_ + auVar76._16_4_ * -0.6931472;
        fVar134 = auVar160._20_4_ + auVar76._20_4_ * -0.6931472;
        fVar135 = auVar160._24_4_ + auVar76._24_4_ * -0.6931472;
        in_ZMM7 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        fVar136 = ((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                   0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5;
        fVar217 = ((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5;
        fVar228 = ((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5;
        fVar229 = ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5;
        fVar230 = ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5;
        fVar231 = ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5;
        fVar232 = ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37e013,
                                     CONCAT424(fVar232,CONCAT420(fVar231,CONCAT416(fVar230,CONCAT412
                                                  (fVar229,CONCAT48(fVar228,CONCAT44(fVar217,fVar136
                                                                                    ))))))));
        auVar97._0_4_ = (int)auVar76._0_4_;
        auVar97._4_4_ = (int)auVar76._4_4_;
        auVar97._8_4_ = (int)auVar76._8_4_;
        auVar97._12_4_ = (int)auVar76._12_4_;
        auVar126._16_4_ = (int)auVar76._16_4_;
        auVar126._0_16_ = auVar97;
        auVar126._20_4_ = (int)auVar76._20_4_;
        auVar126._24_4_ = (int)auVar76._24_4_;
        auVar126._28_4_ = (int)auVar76._28_4_;
        auVar218 = vpslld_avx(auVar97,0x17);
        auVar175 = vpslld_avx(auVar126._16_16_,0x17);
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar175 = vpaddd_avx(auVar175,auVar53);
        auVar218 = vpaddd_avx(auVar218,auVar53);
        auVar82._0_4_ = (fVar86 + fVar274 + fVar86 * fVar86 * fVar136) * auVar218._0_4_ + fVar274;
        auVar82._4_4_ = (fVar130 + fVar277 + fVar130 * fVar130 * fVar217) * auVar218._4_4_ + fVar277
        ;
        auVar82._8_4_ = (fVar131 + fVar278 + fVar131 * fVar131 * fVar228) * auVar218._8_4_ + fVar278
        ;
        auVar82._12_4_ =
             (fVar132 + fVar279 + fVar132 * fVar132 * fVar229) * auVar218._12_4_ + fVar279;
        auVar82._16_4_ =
             (fVar133 + fVar280 + fVar133 * fVar133 * fVar230) * auVar175._0_4_ + fVar280;
        auVar82._20_4_ =
             (fVar134 + fVar281 + fVar134 * fVar134 * fVar231) * auVar175._4_4_ + fVar281;
        auVar82._24_4_ =
             (fVar135 + fVar282 + fVar135 * fVar135 * fVar232) * auVar175._8_4_ + fVar282;
        auVar82._28_4_ = auVar160._28_4_ + -0.6931472 + fVar283 + -0.6931472 + fVar283;
        auVar273 = vdivps_avx(auVar110,auVar82);
        break;
      case 5:
        auVar252._8_4_ = 0x42b0c0a5;
        auVar252._0_8_ = 0x42b0c0a542b0c0a5;
        auVar252._12_4_ = 0x42b0c0a5;
        auVar252._16_4_ = 0x42b0c0a5;
        auVar252._20_4_ = 0x42b0c0a5;
        auVar252._24_4_ = 0x42b0c0a5;
        auVar252._28_4_ = 0x42b0c0a5;
        auVar160 = vminps_avx(auVar273,auVar252);
        auVar263._8_4_ = 0xc2b0c0a5;
        auVar263._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar263._12_4_ = 0xc2b0c0a5;
        auVar263._16_4_ = 0xc2b0c0a5;
        auVar263._20_4_ = 0xc2b0c0a5;
        auVar263._24_4_ = 0xc2b0c0a5;
        auVar263._28_4_ = 0xc2b0c0a5;
        auVar160 = vmaxps_avx(auVar263,auVar160);
        in_ZMM11 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar195._8_4_ = 0x3f000000;
        auVar195._0_8_ = 0x3f0000003f000000;
        auVar195._12_4_ = 0x3f000000;
        auVar195._16_4_ = 0x3f000000;
        auVar195._20_4_ = 0x3f000000;
        auVar195._24_4_ = 0x3f000000;
        auVar195._28_4_ = 0x3f000000;
        auVar114._0_4_ = auVar160._0_4_ * 1.442695 + 0.5;
        auVar114._4_4_ = auVar160._4_4_ * 1.442695 + 0.5;
        auVar114._8_4_ = auVar160._8_4_ * 1.442695 + 0.5;
        auVar114._12_4_ = auVar160._12_4_ * 1.442695 + 0.5;
        auVar114._16_4_ = auVar160._16_4_ * 1.442695 + 0.5;
        auVar114._20_4_ = auVar160._20_4_ * 1.442695 + 0.5;
        auVar114._24_4_ = auVar160._24_4_ * 1.442695 + 0.5;
        auVar114._28_4_ = auVar76._28_4_ + 0.5;
        auVar58 = vroundps_avx(auVar114,1);
        auVar76 = vcmpps_avx(auVar114,auVar58,1);
        auVar76 = vandps_avx(auVar76,auVar110);
        auVar76 = vsubps_avx(auVar58,auVar76);
        auVar26._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar26._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar26._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar26._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar26._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar26._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar26._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar26._28_4_ = auVar58._28_4_;
        auVar160 = vsubps_avx(auVar160,auVar26);
        fVar86 = auVar160._0_4_;
        fVar130 = auVar160._4_4_;
        fVar131 = auVar160._8_4_;
        fVar132 = auVar160._12_4_;
        fVar133 = auVar160._16_4_;
        fVar134 = auVar160._20_4_;
        fVar135 = auVar160._24_4_;
        in_ZMM12 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar95._0_4_ = (int)auVar76._0_4_;
        auVar95._4_4_ = (int)auVar76._4_4_;
        auVar95._8_4_ = (int)auVar76._8_4_;
        auVar95._12_4_ = (int)auVar76._12_4_;
        auVar115._16_4_ = (int)auVar76._16_4_;
        auVar115._0_16_ = auVar95;
        auVar115._20_4_ = (int)auVar76._20_4_;
        auVar115._24_4_ = (int)auVar76._24_4_;
        auVar115._28_4_ = (int)auVar76._28_4_;
        auVar218 = vpslld_avx(auVar95,0x17);
        auVar175 = vpslld_avx(auVar115._16_16_,0x17);
        auVar183._8_4_ = 0x3f800000;
        auVar183._0_8_ = 0x3f8000003f800000;
        auVar183._12_4_ = 0x3f800000;
        auVar175 = vpaddd_avx(auVar175,auVar183);
        auVar218 = vpaddd_avx(auVar218,auVar183);
        auVar78._0_4_ =
             (fVar86 + fVar274 +
             fVar86 * fVar86 *
             (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
               0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar218._0_4_ + fVar274;
        auVar78._4_4_ =
             (fVar130 + fVar277 +
             fVar130 * fVar130 *
             (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
               0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar218._4_4_ + fVar277;
        auVar78._8_4_ =
             (fVar131 + fVar278 +
             fVar131 * fVar131 *
             (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
               0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar218._8_4_ + fVar278;
        auVar78._12_4_ =
             (fVar132 + fVar279 +
             fVar132 * fVar132 *
             (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
               0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar218._12_4_ + fVar279;
        auVar78._16_4_ =
             (fVar133 + fVar280 +
             fVar133 * fVar133 *
             (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
               0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar175._0_4_ + fVar280;
        auVar78._20_4_ =
             (fVar134 + fVar281 +
             fVar134 * fVar134 *
             (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
               0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar175._4_4_ + fVar281;
        auVar78._24_4_ =
             (fVar135 + fVar282 +
             fVar135 * fVar135 *
             (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
               0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar175._8_4_ + fVar282;
        auVar78._28_4_ = auVar160._28_4_ + fVar283 + auVar58._28_4_ + fVar283;
        auVar116._8_4_ = 0x800000;
        auVar116._0_8_ = 0x80000000800000;
        auVar116._12_4_ = 0x800000;
        auVar116._16_4_ = 0x800000;
        auVar116._20_4_ = 0x800000;
        auVar116._24_4_ = 0x800000;
        auVar116._28_4_ = 0x800000;
        auVar58 = vmaxps_avx(auVar78,auVar116);
        auVar175 = vpsrld_avx(auVar58._16_16_,0x17);
        auVar117._8_4_ = 0x807fffff;
        auVar117._0_8_ = 0x807fffff807fffff;
        auVar117._12_4_ = 0x807fffff;
        auVar117._16_4_ = 0x807fffff;
        auVar117._20_4_ = 0x807fffff;
        auVar117._24_4_ = 0x807fffff;
        auVar117._28_4_ = 0x807fffff;
        auVar76 = vandps_avx(auVar58,auVar117);
        auVar188 = vorps_avx(auVar76,auVar195);
        auVar225._8_4_ = 0x3f3504f3;
        auVar225._0_8_ = 0x3f3504f33f3504f3;
        auVar225._12_4_ = 0x3f3504f3;
        auVar225._16_4_ = 0x3f3504f3;
        auVar225._20_4_ = 0x3f3504f3;
        auVar225._24_4_ = 0x3f3504f3;
        auVar225._28_4_ = 0x3f3504f3;
        auVar160 = vcmpps_avx(auVar225,auVar188,2);
        auVar76 = vandnps_avx(auVar160,auVar188);
        fVar86 = auVar76._0_4_ + auVar188._0_4_ + -1.0;
        fVar130 = auVar76._4_4_ + auVar188._4_4_ + -1.0;
        fVar131 = auVar76._8_4_ + auVar188._8_4_ + -1.0;
        fVar132 = auVar76._12_4_ + auVar188._12_4_ + -1.0;
        fVar133 = auVar76._16_4_ + auVar188._16_4_ + -1.0;
        fVar134 = auVar76._20_4_ + auVar188._20_4_ + -1.0;
        fVar135 = auVar76._24_4_ + auVar188._24_4_ + -1.0;
        auVar175 = vpsubd_avx(auVar175,auVar160._16_16_);
        auVar218 = vpsrld_avx(auVar58._0_16_,0x17);
        auVar236._8_4_ = 0xffffff81;
        auVar236._0_8_ = 0xffffff81ffffff81;
        auVar236._12_4_ = 0xffffff81;
        auVar175 = vpaddd_avx(auVar236,auVar175);
        auVar218 = vpsubd_avx(auVar218,auVar160._0_16_);
        auVar218 = vpaddd_avx(auVar236,auVar218);
        auVar162._16_16_ = auVar175;
        auVar162._0_16_ = auVar218;
        auVar160 = vcmpps_avx(auVar78,_DAT_005a71a0,2);
        auVar58 = vcvtdq2ps_avx(auVar162);
        auVar27._4_4_ =
             (auVar58._4_4_ * 0.6931472 + fVar130 +
             fVar130 * fVar130 *
             (((((((((fVar130 * 0.070376836 + -0.1151461) * fVar130 + 0.116769984) * fVar130 +
                   -0.12420141) * fVar130 + 0.14249323) * fVar130 + -0.16668057) * fVar130 +
                0.20000714) * fVar130 + -0.24999994) * fVar130 + 0.3333333) * fVar130 + -0.5)) *
             -2.0;
        auVar27._0_4_ =
             (auVar58._0_4_ * 0.6931472 + fVar86 +
             fVar86 * fVar86 *
             (((((((((fVar86 * 0.070376836 + -0.1151461) * fVar86 + 0.116769984) * fVar86 +
                   -0.12420141) * fVar86 + 0.14249323) * fVar86 + -0.16668057) * fVar86 + 0.20000714
                ) * fVar86 + -0.24999994) * fVar86 + 0.3333333) * fVar86 + -0.5)) * -2.0;
        auVar27._8_4_ =
             (auVar58._8_4_ * 0.6931472 + fVar131 +
             fVar131 * fVar131 *
             (((((((((fVar131 * 0.070376836 + -0.1151461) * fVar131 + 0.116769984) * fVar131 +
                   -0.12420141) * fVar131 + 0.14249323) * fVar131 + -0.16668057) * fVar131 +
                0.20000714) * fVar131 + -0.24999994) * fVar131 + 0.3333333) * fVar131 + -0.5)) *
             -2.0;
        auVar27._12_4_ =
             (auVar58._12_4_ * 0.6931472 + fVar132 +
             fVar132 * fVar132 *
             (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984) * fVar132 +
                   -0.12420141) * fVar132 + 0.14249323) * fVar132 + -0.16668057) * fVar132 +
                0.20000714) * fVar132 + -0.24999994) * fVar132 + 0.3333333) * fVar132 + -0.5)) *
             -2.0;
        auVar27._16_4_ =
             (auVar58._16_4_ * 0.6931472 + fVar133 +
             fVar133 * fVar133 *
             (((((((((fVar133 * 0.070376836 + -0.1151461) * fVar133 + 0.116769984) * fVar133 +
                   -0.12420141) * fVar133 + 0.14249323) * fVar133 + -0.16668057) * fVar133 +
                0.20000714) * fVar133 + -0.24999994) * fVar133 + 0.3333333) * fVar133 + -0.5)) *
             -2.0;
        auVar27._20_4_ =
             (auVar58._20_4_ * 0.6931472 + fVar134 +
             fVar134 * fVar134 *
             (((((((((fVar134 * 0.070376836 + -0.1151461) * fVar134 + 0.116769984) * fVar134 +
                   -0.12420141) * fVar134 + 0.14249323) * fVar134 + -0.16668057) * fVar134 +
                0.20000714) * fVar134 + -0.24999994) * fVar134 + 0.3333333) * fVar134 + -0.5)) *
             -2.0;
        auVar27._24_4_ =
             (auVar58._24_4_ * 0.6931472 + fVar135 +
             fVar135 * fVar135 *
             (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) * fVar135 +
                   -0.12420141) * fVar135 + 0.14249323) * fVar135 + -0.16668057) * fVar135 +
                0.20000714) * fVar135 + -0.24999994) * fVar135 + 0.3333333) * fVar135 + -0.5)) *
             -2.0;
        auVar27._28_4_ = auVar58._28_4_ + auVar76._28_4_ + auVar188._28_4_ + -1.0 + 0.0;
        auVar163._8_4_ = 0x7fffffff;
        auVar163._0_8_ = 0x7fffffff7fffffff;
        auVar163._12_4_ = 0x7fffffff;
        auVar163._16_4_ = 0x7fffffff;
        auVar163._20_4_ = 0x7fffffff;
        auVar163._24_4_ = 0x7fffffff;
        auVar163._28_4_ = 0x7fffffff;
        auVar76 = vblendvps_avx(auVar27,auVar163,auVar160);
        auVar118._8_4_ = 0x42b0c0a5;
        auVar118._0_8_ = 0x42b0c0a542b0c0a5;
        auVar118._12_4_ = 0x42b0c0a5;
        auVar118._16_4_ = 0x42b0c0a5;
        auVar118._20_4_ = 0x42b0c0a5;
        auVar118._24_4_ = 0x42b0c0a5;
        auVar118._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar76,auVar118);
        auVar119._8_4_ = 0xc2b0c0a5;
        auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar119._12_4_ = 0xc2b0c0a5;
        auVar119._16_4_ = 0xc2b0c0a5;
        auVar119._20_4_ = 0xc2b0c0a5;
        auVar119._24_4_ = 0xc2b0c0a5;
        auVar119._28_4_ = 0xc2b0c0a5;
        auVar160 = vmaxps_avx(auVar76,auVar119);
        auVar120._0_4_ = auVar160._0_4_ * 1.442695 + 0.5;
        auVar120._4_4_ = auVar160._4_4_ * 1.442695 + 0.5;
        auVar120._8_4_ = auVar160._8_4_ * 1.442695 + 0.5;
        auVar120._12_4_ = auVar160._12_4_ * 1.442695 + 0.5;
        auVar120._16_4_ = auVar160._16_4_ * 1.442695 + 0.5;
        auVar120._20_4_ = auVar160._20_4_ * 1.442695 + 0.5;
        auVar120._24_4_ = auVar160._24_4_ * 1.442695 + 0.5;
        auVar120._28_4_ = 0xc2afc0a5;
        auVar58 = vroundps_avx(auVar120,1);
        auVar76 = vcmpps_avx(auVar120,auVar58,1);
        auVar76 = vandps_avx(auVar76,auVar110);
        auVar76 = vsubps_avx(auVar58,auVar76);
        auVar28._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar28._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar28._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar28._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar28._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar28._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar28._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar28._28_4_ = auVar58._28_4_;
        auVar160 = vsubps_avx(auVar160,auVar28);
        fVar86 = auVar160._0_4_;
        fVar130 = auVar160._4_4_;
        fVar131 = auVar160._8_4_;
        fVar132 = auVar160._12_4_;
        fVar133 = auVar160._16_4_;
        fVar134 = auVar160._20_4_;
        fVar135 = auVar160._24_4_;
        auVar216 = ZEXT864(0) << 0x20;
        in_ZMM7 = ZEXT3264(auVar195);
        auVar85 = ZEXT3264(auVar110);
        fVar136 = ((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                   0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5;
        fVar217 = ((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5;
        fVar228 = ((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5;
        fVar229 = ((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5;
        fVar230 = ((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5;
        fVar231 = ((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5;
        fVar232 = ((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3f37d30c,
                                     CONCAT424(fVar232,CONCAT420(fVar231,CONCAT416(fVar230,CONCAT412
                                                  (fVar229,CONCAT48(fVar228,CONCAT44(fVar217,fVar136
                                                                                    ))))))));
        auVar96._0_4_ = (int)auVar76._0_4_;
        auVar96._4_4_ = (int)auVar76._4_4_;
        auVar96._8_4_ = (int)auVar76._8_4_;
        auVar96._12_4_ = (int)auVar76._12_4_;
        auVar121._16_4_ = (int)auVar76._16_4_;
        auVar121._0_16_ = auVar96;
        auVar121._20_4_ = (int)auVar76._20_4_;
        auVar121._24_4_ = (int)auVar76._24_4_;
        auVar121._28_4_ = (int)auVar76._28_4_;
        auVar218 = vpslld_avx(auVar96,0x17);
        auVar175 = vpslld_avx(auVar121._16_16_,0x17);
        auVar175 = vpaddd_avx(auVar175,auVar183);
        auVar218 = vpaddd_avx(auVar218,auVar183);
        auVar79._0_4_ = (fVar86 + fVar274 + fVar86 * fVar86 * fVar136) * auVar218._0_4_ + fVar274;
        auVar79._4_4_ = (fVar130 + fVar277 + fVar130 * fVar130 * fVar217) * auVar218._4_4_ + fVar277
        ;
        auVar79._8_4_ = (fVar131 + fVar278 + fVar131 * fVar131 * fVar228) * auVar218._8_4_ + fVar278
        ;
        auVar79._12_4_ =
             (fVar132 + fVar279 + fVar132 * fVar132 * fVar229) * auVar218._12_4_ + fVar279;
        auVar79._16_4_ =
             (fVar133 + fVar280 + fVar133 * fVar133 * fVar230) * auVar175._0_4_ + fVar280;
        auVar79._20_4_ =
             (fVar134 + fVar281 + fVar134 * fVar134 * fVar231) * auVar175._4_4_ + fVar281;
        auVar79._24_4_ =
             (fVar135 + fVar282 + fVar135 * fVar135 * fVar232) * auVar175._8_4_ + fVar282;
        auVar79._28_4_ = auVar160._28_4_ + fVar283 + auVar58._28_4_ + fVar283;
        auVar59._8_4_ = 0x40000000;
        auVar59._0_8_ = 0x4000000040000000;
        auVar59._12_4_ = 0x40000000;
        auVar59._16_4_ = 0x40000000;
        auVar59._20_4_ = 0x40000000;
        auVar59._24_4_ = 0x40000000;
        auVar59._28_4_ = 0x40000000;
        auVar76 = vdivps_avx(auVar59,auVar79);
        auVar75._0_4_ = auVar76._0_4_ + -1.0;
        auVar75._4_4_ = auVar76._4_4_ + -1.0;
        auVar75._8_4_ = auVar76._8_4_ + -1.0;
        auVar75._12_4_ = auVar76._12_4_ + -1.0;
        auVar75._16_4_ = auVar76._16_4_ + -1.0;
        auVar75._20_4_ = auVar76._20_4_ + -1.0;
        auVar75._24_4_ = auVar76._24_4_ + -1.0;
        goto LAB_002fb53f;
      case 6:
        pfVar40 = (float *)(this->super_InnerProduct).activation_params.data;
        fVar274 = *pfVar40;
        fVar277 = pfVar40[1];
        auVar83._0_4_ = auVar273._0_4_ * fVar274 + fVar277;
        auVar83._4_4_ = auVar273._4_4_ * fVar274 + fVar277;
        auVar83._8_4_ = auVar273._8_4_ * fVar274 + fVar277;
        auVar83._12_4_ = auVar273._12_4_ * fVar274 + fVar277;
        auVar83._16_4_ = auVar273._16_4_ * fVar274 + fVar277;
        auVar83._20_4_ = auVar273._20_4_ * fVar274 + fVar277;
        auVar83._24_4_ = auVar273._24_4_ * fVar274 + fVar277;
        auVar83._28_4_ = fVar274 + fVar277;
        auVar76 = vmaxps_avx(auVar160,auVar83);
        auVar76 = vminps_avx(auVar76,auVar110);
        auVar75 = auVar76._0_28_;
LAB_002fb53f:
        auVar273._4_4_ = auVar273._4_4_ * auVar75._4_4_;
        auVar273._0_4_ = auVar273._0_4_ * auVar75._0_4_;
        auVar273._8_4_ = auVar273._8_4_ * auVar75._8_4_;
        auVar273._12_4_ = auVar273._12_4_ * auVar75._12_4_;
        auVar273._16_4_ = auVar273._16_4_ * auVar75._16_4_;
        auVar273._20_4_ = auVar273._20_4_ * auVar75._20_4_;
        auVar273._24_4_ = auVar273._24_4_ * auVar75._24_4_;
      }
      auVar175 = in_ZMM12._0_16_;
      *(undefined1 (*) [32])((long)top_blob->data + local_a8 * 0x20) = auVar273;
      lVar36 = lVar36 + local_90;
      lVar41 = lVar41 + local_90;
      local_b8 = local_b8 + local_90;
      lVar51 = lVar51 + local_90;
      local_b0 = local_b0 + local_90;
      local_c0 = local_c0 + local_90;
      lVar46 = local_98 + local_90;
      lVar49 = local_a0 + local_90;
      uVar35 = local_a8 + 1;
      local_c8 = this;
      local_80 = (ulong)uVar18;
    } while (local_a8 + 1 != local_88);
  }
  uVar35 = local_d0 & 0xfffffffffffffff8;
  uVar34 = uVar38 >> 2 & 1;
  if (uVar34 == 0) goto LAB_002fbc81;
  if (pvVar20 == (void *)0x0) {
    fVar274 = 0.0;
    fVar277 = 0.0;
    fVar278 = 0.0;
    fVar279 = 0.0;
  }
  else {
    pfVar40 = (float *)((long)pvVar20 + uVar35 * 4);
    fVar274 = *pfVar40;
    fVar277 = pfVar40[1];
    fVar278 = pfVar40[2];
    fVar279 = pfVar40[3];
  }
  pvVar22 = (this->weight_data_tm).data;
  pvVar39 = (void *)((long)pvVar22 + uVar35 * lVar44 * 4);
  if ((int)uVar50 < 8) {
    uVar45 = 0;
    lVar51 = (uVar35 | 1) * lVar44 * 4;
    lVar41 = (uVar35 | 2) * lVar44 * 4;
    lVar36 = (uVar35 | 3) * lVar44 * 4;
    auVar127 = ZEXT832(0);
    auVar196 = ZEXT832(0);
    auVar164 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar84 = ZEXT832(0);
    pfVar40 = (float *)local_138._0_8_;
  }
  else {
    uVar45 = uVar50 & 0xfffffff8;
    lVar51 = (uVar35 + 3) * lVar44;
    lVar41 = (uVar35 + 2) * lVar44;
    lVar46 = (uVar35 + 1) * lVar44;
    auVar85 = ZEXT864(0);
    iVar31 = 7;
    lVar49 = 0;
    auVar268 = ZEXT1664((undefined1  [16])0x0);
    auVar129 = ZEXT864(0);
    auVar216 = ZEXT864(0);
    do {
      pfVar40 = (float *)(local_138._0_8_ + lVar49);
      fVar280 = *pfVar40;
      fVar281 = pfVar40[1];
      fVar282 = pfVar40[2];
      fVar283 = pfVar40[3];
      fVar86 = pfVar40[4];
      fVar130 = pfVar40[5];
      fVar131 = pfVar40[6];
      pfVar33 = (float *)((long)pvVar39 + lVar49);
      auVar127._0_4_ = fVar280 * *pfVar33 + auVar216._0_4_;
      auVar127._4_4_ = fVar281 * pfVar33[1] + auVar216._4_4_;
      auVar127._8_4_ = fVar282 * pfVar33[2] + auVar216._8_4_;
      auVar127._12_4_ = fVar283 * pfVar33[3] + auVar216._12_4_;
      auVar127._16_4_ = fVar86 * pfVar33[4] + auVar216._16_4_;
      auVar127._20_4_ = fVar130 * pfVar33[5] + auVar216._20_4_;
      auVar127._24_4_ = fVar131 * pfVar33[6] + auVar216._24_4_;
      fVar132 = in_ZMM6._28_4_;
      auVar127._28_4_ = fVar132 + auVar216._28_4_;
      auVar216 = ZEXT3264(auVar127);
      pfVar33 = (float *)((long)pvVar22 + lVar49 + lVar46 * 4);
      in_ZMM6 = ZEXT3264(CONCAT428(fVar132,CONCAT424(fVar131 * pfVar33[6],
                                                     CONCAT420(fVar130 * pfVar33[5],
                                                               CONCAT416(fVar86 * pfVar33[4],
                                                                         CONCAT412(fVar283 * pfVar33
                                                  [3],CONCAT48(fVar282 * pfVar33[2],
                                                               CONCAT44(fVar281 * pfVar33[1],
                                                                        fVar280 * *pfVar33))))))));
      pfVar37 = (float *)((long)pvVar22 + lVar49 + lVar41 * 4);
      auVar165._0_4_ = fVar280 * *pfVar37;
      auVar165._4_4_ = fVar281 * pfVar37[1];
      auVar165._8_4_ = fVar282 * pfVar37[2];
      auVar165._12_4_ = fVar283 * pfVar37[3];
      auVar165._16_4_ = fVar86 * pfVar37[4];
      auVar165._20_4_ = fVar130 * pfVar37[5];
      auVar165._28_36_ = in_ZMM7._28_36_;
      auVar165._24_4_ = fVar131 * pfVar37[6];
      auVar196._0_4_ = fVar280 * *pfVar33 + auVar129._0_4_;
      auVar196._4_4_ = fVar281 * pfVar33[1] + auVar129._4_4_;
      auVar196._8_4_ = fVar282 * pfVar33[2] + auVar129._8_4_;
      auVar196._12_4_ = fVar283 * pfVar33[3] + auVar129._12_4_;
      auVar196._16_4_ = fVar86 * pfVar33[4] + auVar129._16_4_;
      auVar196._20_4_ = fVar130 * pfVar33[5] + auVar129._20_4_;
      auVar196._24_4_ = fVar131 * pfVar33[6] + auVar129._24_4_;
      auVar196._28_4_ = fVar132 + auVar129._28_4_;
      auVar129 = ZEXT3264(auVar196);
      auVar164._0_4_ = auVar165._0_4_ + auVar268._0_4_;
      auVar164._4_4_ = auVar165._4_4_ + auVar268._4_4_;
      auVar164._8_4_ = auVar165._8_4_ + auVar268._8_4_;
      auVar164._12_4_ = auVar165._12_4_ + auVar268._12_4_;
      auVar164._16_4_ = auVar165._16_4_ + auVar268._16_4_;
      auVar164._20_4_ = auVar165._20_4_ + auVar268._20_4_;
      auVar164._24_4_ = auVar165._24_4_ + auVar268._24_4_;
      auVar164._28_4_ = in_ZMM7._28_4_ + auVar268._28_4_;
      auVar268 = ZEXT3264(auVar164);
      pfVar33 = (float *)((long)pvVar22 + lVar49 + lVar51 * 4);
      auVar84._0_4_ = fVar280 * *pfVar33 + auVar85._0_4_;
      auVar84._4_4_ = fVar281 * pfVar33[1] + auVar85._4_4_;
      auVar84._8_4_ = fVar282 * pfVar33[2] + auVar85._8_4_;
      auVar84._12_4_ = fVar283 * pfVar33[3] + auVar85._12_4_;
      auVar84._16_4_ = fVar86 * pfVar33[4] + auVar85._16_4_;
      auVar84._20_4_ = fVar130 * pfVar33[5] + auVar85._20_4_;
      auVar84._24_4_ = fVar131 * pfVar33[6] + auVar85._24_4_;
      auVar84._28_4_ = pfVar40[7] + auVar85._28_4_;
      auVar85 = ZEXT3264(auVar84);
      iVar31 = iVar31 + 8;
      lVar49 = lVar49 + 0x20;
      in_ZMM7 = ZEXT3264(auVar165._0_32_);
    } while (iVar31 < (int)uVar50);
    lVar36 = lVar49 + lVar51 * 4;
    lVar41 = lVar49 + lVar41 * 4;
    lVar51 = lVar49 + lVar46 * 4;
    pvVar39 = (void *)((long)pvVar39 + lVar49);
    pfVar40 = (float *)(local_138._0_8_ + lVar49);
  }
  lVar51 = (long)pvVar22 + lVar51;
  lVar41 = (long)pvVar22 + lVar41;
  lVar36 = (long)pvVar22 + lVar36;
  auVar211 = ZEXT816(0) << 0x40;
  if ((int)(uVar45 | 3) < (int)uVar50) {
    lVar46 = 0;
    auVar85 = ZEXT864(0);
    uVar47 = uVar45;
    auVar218 = ZEXT816(0);
    auVar89 = auVar211;
    auVar179 = ZEXT816(0);
    do {
      pfVar33 = (float *)((long)pfVar40 + lVar46);
      fVar280 = *pfVar33;
      fVar281 = pfVar33[1];
      fVar282 = pfVar33[2];
      fVar283 = pfVar33[3];
      pfVar33 = (float *)((long)pvVar39 + lVar46);
      auVar211._0_4_ = fVar280 * *pfVar33 + auVar89._0_4_;
      auVar211._4_4_ = fVar281 * pfVar33[1] + auVar89._4_4_;
      auVar211._8_4_ = fVar282 * pfVar33[2] + auVar89._8_4_;
      auVar211._12_4_ = fVar283 * pfVar33[3] + auVar89._12_4_;
      pfVar33 = (float *)(lVar51 + lVar46);
      auVar237._0_4_ = fVar280 * *pfVar33 + auVar85._0_4_;
      auVar237._4_4_ = fVar281 * pfVar33[1] + auVar85._4_4_;
      auVar237._8_4_ = fVar282 * pfVar33[2] + auVar85._8_4_;
      auVar237._12_4_ = fVar283 * pfVar33[3] + auVar85._12_4_;
      auVar85 = ZEXT1664(auVar237);
      pfVar33 = (float *)(lVar41 + lVar46);
      auVar222._0_4_ = fVar280 * *pfVar33 + auVar179._0_4_;
      auVar222._4_4_ = fVar281 * pfVar33[1] + auVar179._4_4_;
      auVar222._8_4_ = fVar282 * pfVar33[2] + auVar179._8_4_;
      auVar222._12_4_ = fVar283 * pfVar33[3] + auVar179._12_4_;
      pfVar33 = (float *)(lVar36 + lVar46);
      auVar205._0_4_ = fVar280 * *pfVar33 + auVar218._0_4_;
      auVar205._4_4_ = fVar281 * pfVar33[1] + auVar218._4_4_;
      auVar205._8_4_ = fVar282 * pfVar33[2] + auVar218._8_4_;
      auVar205._12_4_ = fVar283 * pfVar33[3] + auVar218._12_4_;
      uVar45 = uVar47 + 4;
      iVar31 = uVar47 + 7;
      lVar46 = lVar46 + 0x10;
      uVar47 = uVar45;
      auVar218 = auVar205;
      auVar89 = auVar211;
      auVar179 = auVar222;
    } while (iVar31 < (int)uVar50);
    pfVar40 = (float *)((long)pfVar40 + lVar46);
    lVar36 = lVar36 + lVar46;
    lVar41 = lVar41 + lVar46;
    lVar51 = lVar51 + lVar46;
    pvVar39 = (void *)((long)pvVar39 + lVar46);
  }
  else {
    auVar237 = SUB6416(ZEXT864(0),0);
    auVar222 = ZEXT816(0);
    auVar205 = ZEXT816(0);
  }
  if (uVar50 - uVar45 != 0 && (int)uVar45 <= (int)uVar50) {
    lVar46 = 0;
    do {
      auVar218 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar39 + lVar46 * 4)),
                               ZEXT416(*(uint *)(lVar51 + lVar46 * 4)),0x10);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)(lVar41 + lVar46 * 4)),0x20);
      auVar218 = vinsertps_avx(auVar218,ZEXT416(*(uint *)(lVar36 + lVar46 * 4)),0x30);
      fVar280 = pfVar40[lVar46];
      fVar274 = auVar218._0_4_ * fVar280 + fVar274;
      fVar277 = auVar218._4_4_ * fVar280 + fVar277;
      fVar278 = auVar218._8_4_ * fVar280 + fVar278;
      fVar279 = auVar218._12_4_ * fVar280 + fVar279;
      lVar46 = lVar46 + 1;
    } while (uVar50 - uVar45 != (int)lVar46);
  }
  auVar76 = vhaddps_avx(auVar127,auVar196);
  auVar110 = vhaddps_avx(auVar164,auVar84);
  auVar76 = vhaddps_avx(auVar76,auVar110);
  auVar89 = vunpcklps_avx(auVar211,auVar237);
  auVar179 = vunpcklps_avx(auVar222,auVar205);
  auVar88 = vunpckhps_avx(auVar211,auVar237);
  auVar139 = vunpckhps_avx(auVar222,auVar205);
  auVar218 = vmovlhps_avx(auVar89,auVar179);
  auVar179 = vunpckhpd_avx(auVar89,auVar179);
  auVar89 = vmovlhps_avx(auVar88,auVar139);
  auVar88 = vunpckhpd_avx(auVar88,auVar139);
  auVar54._0_4_ =
       auVar179._0_4_ + auVar218._0_4_ + auVar89._0_4_ + auVar88._0_4_ + auVar76._0_4_ +
       auVar76._16_4_ + fVar274;
  auVar54._4_4_ =
       auVar179._4_4_ + auVar218._4_4_ + auVar89._4_4_ + auVar88._4_4_ + auVar76._4_4_ +
       auVar76._20_4_ + fVar277;
  auVar54._8_4_ =
       auVar179._8_4_ + auVar218._8_4_ + auVar89._8_4_ + auVar88._8_4_ + auVar76._8_4_ +
       auVar76._24_4_ + fVar278;
  auVar54._12_4_ =
       auVar179._12_4_ + auVar218._12_4_ + auVar89._12_4_ + auVar88._12_4_ + auVar76._12_4_ +
       auVar76._28_4_ + fVar279;
  switch(uVar18) {
  case 1:
    auVar29._12_4_ = 0;
    auVar29._0_12_ = ZEXT412(0);
    auVar54 = vmaxps_avx(auVar54,auVar29 << 0x20);
    break;
  case 2:
    auVar218 = vmaxps_avx(auVar54,ZEXT416(0) << 0x20);
    auVar89 = vminps_avx(auVar54,ZEXT416(0) << 0x20);
    fVar274 = *(this->super_InnerProduct).activation_params.data;
    auVar54._0_4_ = fVar274 * auVar89._0_4_ + auVar218._0_4_;
    auVar54._4_4_ = fVar274 * auVar89._4_4_ + auVar218._4_4_;
    auVar54._8_4_ = fVar274 * auVar89._8_4_ + auVar218._8_4_;
    auVar54._12_4_ = fVar274 * auVar89._12_4_ + auVar218._12_4_;
    break;
  case 3:
    puVar21 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
    uVar11 = *puVar21;
    auVar68._4_4_ = uVar11;
    auVar68._0_4_ = uVar11;
    auVar68._8_4_ = uVar11;
    auVar68._12_4_ = uVar11;
    uVar11 = puVar21[1];
    auVar105._4_4_ = uVar11;
    auVar105._0_4_ = uVar11;
    auVar105._8_4_ = uVar11;
    auVar105._12_4_ = uVar11;
    auVar218 = vmaxps_avx(auVar54,auVar68);
    auVar54 = vminps_avx(auVar218,auVar105);
    break;
  case 4:
    uVar42 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
    auVar55._0_8_ = uVar42 ^ 0x8000000080000000;
    auVar55._8_4_ = -auVar54._8_4_;
    auVar55._12_4_ = -auVar54._12_4_;
    auVar69._8_4_ = 0x42b0c0a5;
    auVar69._0_8_ = 0x42b0c0a542b0c0a5;
    auVar69._12_4_ = 0x42b0c0a5;
    auVar218 = vminps_avx(auVar55,auVar69);
    auVar70._8_4_ = 0xc2b0c0a5;
    auVar70._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar70._12_4_ = 0xc2b0c0a5;
    auVar179 = vmaxps_avx(auVar218,auVar70);
    auVar71._0_4_ = auVar179._0_4_ * 1.442695 + 0.5;
    auVar71._4_4_ = auVar179._4_4_ * 1.442695 + 0.5;
    auVar71._8_4_ = auVar179._8_4_ * 1.442695 + 0.5;
    auVar71._12_4_ = auVar179._12_4_ * 1.442695 + 0.5;
    auVar150._0_4_ = (int)auVar71._0_4_;
    auVar150._4_4_ = (int)auVar71._4_4_;
    auVar150._8_4_ = (int)auVar71._8_4_;
    auVar150._12_4_ = (int)auVar71._12_4_;
    auVar89 = vcvtdq2ps_avx(auVar150);
    auVar218 = vcmpps_avx(auVar71,auVar89,1);
    auVar185._8_4_ = 0x3f800000;
    auVar185._0_8_ = 0x3f8000003f800000;
    auVar185._12_4_ = 0x3f800000;
    auVar218 = vandps_avx(auVar218,auVar185);
    auVar218 = vsubps_avx(auVar89,auVar218);
    fVar274 = auVar179._0_4_ + auVar218._0_4_ * -0.6931472;
    fVar277 = auVar179._4_4_ + auVar218._4_4_ * -0.6931472;
    fVar278 = auVar179._8_4_ + auVar218._8_4_ * -0.6931472;
    fVar279 = auVar179._12_4_ + auVar218._12_4_ * -0.6931472;
    auVar72._0_4_ = (int)auVar218._0_4_;
    auVar72._4_4_ = (int)auVar218._4_4_;
    auVar72._8_4_ = (int)auVar218._8_4_;
    auVar72._12_4_ = (int)auVar218._12_4_;
    auVar218 = vpslld_avx(auVar72,0x17);
    auVar218 = vpaddd_avx(auVar218,auVar185);
    auVar56._0_4_ =
         (fVar274 + 1.0 +
         fVar274 * fVar274 *
         (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
           0.041665796) * fVar274 + 0.16666666) * fVar274 + 0.5)) * auVar218._0_4_ + 1.0;
    auVar56._4_4_ =
         (fVar277 + 1.0 +
         fVar277 * fVar277 *
         (((((fVar277 * 0.00019875691 + 0.0013981999) * fVar277 + 0.008333452) * fVar277 +
           0.041665796) * fVar277 + 0.16666666) * fVar277 + 0.5)) * auVar218._4_4_ + 1.0;
    auVar56._8_4_ =
         (fVar278 + 1.0 +
         fVar278 * fVar278 *
         (((((fVar278 * 0.00019875691 + 0.0013981999) * fVar278 + 0.008333452) * fVar278 +
           0.041665796) * fVar278 + 0.16666666) * fVar278 + 0.5)) * auVar218._8_4_ + 1.0;
    auVar56._12_4_ =
         (fVar279 + 1.0 +
         fVar279 * fVar279 *
         (((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) * fVar279 +
           0.041665796) * fVar279 + 0.16666666) * fVar279 + 0.5)) * auVar218._12_4_ + 1.0;
    auVar54 = vdivps_avx(auVar185,auVar56);
    break;
  case 5:
    auVar62._8_4_ = 0x42b0c0a5;
    auVar62._0_8_ = 0x42b0c0a542b0c0a5;
    auVar62._12_4_ = 0x42b0c0a5;
    auVar175 = vminps_avx(auVar54,auVar62);
    auVar98._8_4_ = 0xc2b0c0a5;
    auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar98._12_4_ = 0xc2b0c0a5;
    auVar89 = vmaxps_avx(auVar175,auVar98);
    auVar184._8_4_ = 0x3f000000;
    auVar184._0_8_ = 0x3f0000003f000000;
    auVar184._12_4_ = 0x3f000000;
    auVar63._0_4_ = auVar89._0_4_ * 1.442695 + 0.5;
    auVar63._4_4_ = auVar89._4_4_ * 1.442695 + 0.5;
    auVar63._8_4_ = auVar89._8_4_ * 1.442695 + 0.5;
    auVar63._12_4_ = auVar89._12_4_ * 1.442695 + 0.5;
    auVar212._0_4_ = (int)auVar63._0_4_;
    auVar212._4_4_ = (int)auVar63._4_4_;
    auVar212._8_4_ = (int)auVar63._8_4_;
    auVar212._12_4_ = (int)auVar63._12_4_;
    auVar218 = vcvtdq2ps_avx(auVar212);
    auVar175 = vcmpps_avx(auVar63,auVar218,1);
    auVar149._8_4_ = 0x3f800000;
    auVar149._0_8_ = 0x3f8000003f800000;
    auVar149._12_4_ = 0x3f800000;
    auVar175 = vandps_avx(auVar175,auVar149);
    auVar175 = vsubps_avx(auVar218,auVar175);
    auVar238._0_4_ = auVar175._0_4_ * 0.6931472;
    auVar238._4_4_ = auVar175._4_4_ * 0.6931472;
    auVar238._8_4_ = auVar175._8_4_ * 0.6931472;
    auVar238._12_4_ = auVar175._12_4_ * 0.6931472;
    auVar218 = vsubps_avx(auVar89,auVar238);
    fVar274 = auVar218._0_4_;
    fVar277 = auVar218._4_4_;
    fVar278 = auVar218._8_4_;
    fVar279 = auVar218._12_4_;
    auVar272._0_4_ = (int)auVar175._0_4_;
    auVar272._4_4_ = (int)auVar175._4_4_;
    auVar272._8_4_ = (int)auVar175._8_4_;
    auVar272._12_4_ = (int)auVar175._12_4_;
    auVar175 = vpslld_avx(auVar272,0x17);
    auVar175 = vpaddd_avx(auVar175,auVar149);
    auVar64._0_4_ =
         auVar175._0_4_ *
         (fVar274 + 1.0 +
         fVar274 * fVar274 *
         (fVar274 * ((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
                     0.041665796) * fVar274 + 0.16666666) + 0.5)) + 1.0;
    auVar64._4_4_ =
         auVar175._4_4_ *
         (fVar277 + 1.0 +
         fVar277 * fVar277 *
         (fVar277 * ((((fVar277 * 0.00019875691 + 0.0013981999) * fVar277 + 0.008333452) * fVar277 +
                     0.041665796) * fVar277 + 0.16666666) + 0.5)) + 1.0;
    auVar64._8_4_ =
         auVar175._8_4_ *
         (fVar278 + 1.0 +
         fVar278 * fVar278 *
         (fVar278 * ((((fVar278 * 0.00019875691 + 0.0013981999) * fVar278 + 0.008333452) * fVar278 +
                     0.041665796) * fVar278 + 0.16666666) + 0.5)) + 1.0;
    auVar64._12_4_ =
         auVar175._12_4_ *
         (fVar279 + 1.0 +
         fVar279 * fVar279 *
         (fVar279 * ((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) * fVar279 +
                     0.041665796) * fVar279 + 0.16666666) + 0.5)) + 1.0;
    auVar89 = vcmpps_avx(auVar64,ZEXT816(0) << 0x40,2);
    auVar269._8_4_ = 0x800000;
    auVar269._0_8_ = 0x80000000800000;
    auVar269._12_4_ = 0x800000;
    auVar175 = vmaxps_avx(auVar269,auVar64);
    auVar218 = vpsrld_avx(auVar175,0x17);
    auVar275._8_4_ = 0x807fffff;
    auVar275._0_8_ = 0x807fffff807fffff;
    auVar275._12_4_ = 0x807fffff;
    auVar175 = vandps_avx(auVar275,auVar175);
    auVar88 = vorps_avx(auVar175,auVar184);
    auVar276._8_4_ = 0xffffff82;
    auVar276._0_8_ = 0xffffff82ffffff82;
    auVar276._12_4_ = 0xffffff82;
    auVar139 = vpaddd_avx(auVar218,auVar276);
    auVar270._8_4_ = 0x3f3504f3;
    auVar270._0_8_ = 0x3f3504f33f3504f3;
    auVar270._12_4_ = 0x3f3504f3;
    auVar179 = vcmpps_avx(auVar88,auVar270,1);
    auVar218 = vandps_avx(auVar179,auVar88);
    auVar175._8_4_ = 0xbf800000;
    auVar175._0_8_ = 0xbf800000bf800000;
    auVar175._12_4_ = 0xbf800000;
    fVar274 = auVar218._0_4_ + auVar88._0_4_ + -1.0;
    fVar277 = auVar218._4_4_ + auVar88._4_4_ + -1.0;
    fVar278 = auVar218._8_4_ + auVar88._8_4_ + -1.0;
    fVar279 = auVar218._12_4_ + auVar88._12_4_ + -1.0;
    auVar88 = vcvtdq2ps_avx(auVar139);
    auVar218 = vandps_avx(auVar179,auVar149);
    auVar218 = vsubps_avx(auVar88,auVar218);
    auVar65._0_4_ =
         (fVar274 + auVar218._0_4_ * 0.6931472 +
         fVar274 * fVar274 *
         (fVar274 * (fVar274 * (fVar274 * (fVar274 * (fVar274 * (fVar274 * (fVar274 * (fVar274 * (
                                                  fVar274 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar65._4_4_ =
         (fVar277 + auVar218._4_4_ * 0.6931472 +
         fVar277 * fVar277 *
         (fVar277 * (fVar277 * (fVar277 * (fVar277 * (fVar277 * (fVar277 * (fVar277 * (fVar277 * (
                                                  fVar277 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar65._8_4_ =
         (fVar278 + auVar218._8_4_ * 0.6931472 +
         fVar278 * fVar278 *
         (fVar278 * (fVar278 * (fVar278 * (fVar278 * (fVar278 * (fVar278 * (fVar278 * (fVar278 * (
                                                  fVar278 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar65._12_4_ =
         (fVar279 + auVar218._12_4_ * 0.6931472 +
         fVar279 * fVar279 *
         (fVar279 * (fVar279 * (fVar279 * (fVar279 * (fVar279 * (fVar279 * (fVar279 * (fVar279 * (
                                                  fVar279 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                          0.20000714) + -0.24999994) + 0.3333333) + -0.5)) * -2.0;
    auVar99._8_4_ = 0x7fffffff;
    auVar99._0_8_ = 0x7fffffff7fffffff;
    auVar99._12_4_ = 0x7fffffff;
    auVar218 = vblendvps_avx(auVar65,auVar99,auVar89);
    auVar100._8_4_ = 0x42b0c0a5;
    auVar100._0_8_ = 0x42b0c0a542b0c0a5;
    auVar100._12_4_ = 0x42b0c0a5;
    auVar218 = vminps_avx(auVar218,auVar100);
    auVar101._8_4_ = 0xc2b0c0a5;
    auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar101._12_4_ = 0xc2b0c0a5;
    auVar179 = vmaxps_avx(auVar218,auVar101);
    auVar102._0_4_ = auVar179._0_4_ * 1.442695 + 0.5;
    auVar102._4_4_ = auVar179._4_4_ * 1.442695 + 0.5;
    auVar102._8_4_ = auVar179._8_4_ * 1.442695 + 0.5;
    auVar102._12_4_ = auVar179._12_4_ * 1.442695 + 0.5;
    auVar206._0_4_ = (int)auVar102._0_4_;
    auVar206._4_4_ = (int)auVar102._4_4_;
    auVar206._8_4_ = (int)auVar102._8_4_;
    auVar206._12_4_ = (int)auVar102._12_4_;
    auVar89 = vcvtdq2ps_avx(auVar206);
    auVar218 = vcmpps_avx(auVar102,auVar89,1);
    auVar218 = vandps_avx(auVar218,auVar149);
    auVar218 = vsubps_avx(auVar89,auVar218);
    auVar207._0_4_ = auVar218._0_4_ * 0.6931472;
    auVar207._4_4_ = auVar218._4_4_ * 0.6931472;
    auVar207._8_4_ = auVar218._8_4_ * 0.6931472;
    auVar207._12_4_ = auVar218._12_4_ * 0.6931472;
    auVar89 = vsubps_avx(auVar179,auVar207);
    fVar274 = auVar89._0_4_;
    fVar277 = auVar89._4_4_;
    fVar278 = auVar89._8_4_;
    fVar279 = auVar89._12_4_;
    auVar103._0_4_ = (int)auVar218._0_4_;
    auVar103._4_4_ = (int)auVar218._4_4_;
    auVar103._8_4_ = (int)auVar218._8_4_;
    auVar103._12_4_ = (int)auVar218._12_4_;
    auVar218 = vpslld_avx(auVar103,0x17);
    auVar218 = vpaddd_avx(auVar218,auVar149);
    auVar66._0_4_ =
         (fVar274 + 1.0 +
         fVar274 * fVar274 *
         (((((fVar274 * 0.00019875691 + 0.0013981999) * fVar274 + 0.008333452) * fVar274 +
           0.041665796) * fVar274 + 0.16666666) * fVar274 + 0.5)) * auVar218._0_4_ + 1.0;
    auVar66._4_4_ =
         (fVar277 + 1.0 +
         fVar277 * fVar277 *
         (((((fVar277 * 0.00019875691 + 0.0013981999) * fVar277 + 0.008333452) * fVar277 +
           0.041665796) * fVar277 + 0.16666666) * fVar277 + 0.5)) * auVar218._4_4_ + 1.0;
    auVar66._8_4_ =
         (fVar278 + 1.0 +
         fVar278 * fVar278 *
         (((((fVar278 * 0.00019875691 + 0.0013981999) * fVar278 + 0.008333452) * fVar278 +
           0.041665796) * fVar278 + 0.16666666) * fVar278 + 0.5)) * auVar218._8_4_ + 1.0;
    auVar66._12_4_ =
         (fVar279 + 1.0 +
         fVar279 * fVar279 *
         (((((fVar279 * 0.00019875691 + 0.0013981999) * fVar279 + 0.008333452) * fVar279 +
           0.041665796) * fVar279 + 0.16666666) * fVar279 + 0.5)) * auVar218._12_4_ + 1.0;
    auVar104._8_4_ = 0x40000000;
    auVar104._0_8_ = 0x4000000040000000;
    auVar104._12_4_ = 0x40000000;
    auVar218 = vdivps_avx(auVar104,auVar66);
    auVar67._0_4_ = auVar218._0_4_ + -1.0;
    auVar67._4_4_ = auVar218._4_4_ + -1.0;
    auVar67._8_4_ = auVar218._8_4_ + -1.0;
    auVar67._12_4_ = auVar218._12_4_ + -1.0;
    goto LAB_002fbc67;
  case 6:
    pfVar40 = (float *)(this->super_InnerProduct).activation_params.data;
    fVar274 = *pfVar40;
    fVar277 = pfVar40[1];
    auVar73._0_4_ = fVar274 * auVar54._0_4_ + fVar277;
    auVar73._4_4_ = fVar274 * auVar54._4_4_ + fVar277;
    auVar73._8_4_ = fVar274 * auVar54._8_4_ + fVar277;
    auVar73._12_4_ = fVar274 * auVar54._12_4_ + fVar277;
    auVar218 = vmaxps_avx(auVar73,ZEXT416(0) << 0x20);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = 0x3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar67 = vminps_avx(auVar218,auVar106);
LAB_002fbc67:
    auVar54._0_4_ = auVar67._0_4_ * auVar54._0_4_;
    auVar54._4_4_ = auVar67._4_4_ * auVar54._4_4_;
    auVar54._8_4_ = auVar67._8_4_ * auVar54._8_4_;
    auVar54._12_4_ = auVar67._12_4_ * auVar54._12_4_;
  }
  *(undefined1 (*) [16])((long)top_blob->data + uVar35 * 4) = auVar54;
LAB_002fbc81:
  iVar31 = 0;
  iVar32 = (int)uVar35 + uVar34 * 4;
  if (iVar32 < (int)uVar38) {
    pfVar40 = (float *)(this->super_InnerProduct).activation_params.data;
    pvVar39 = (this->weight_data_tm).data;
    pvVar22 = top_blob->data;
    local_150 = uVar50 & 0xfffffff8;
    uVar35 = (ulong)iVar32;
    auVar216 = ZEXT3264(_DAT_005a4880);
    auVar268 = ZEXT3264(_DAT_005a48a0);
    local_e8._8_8_ = 0x8000000000000000;
    local_e8._0_8_ = 0x8000000000000000;
    auVar129 = ZEXT1664(local_e8);
    auVar175 = vpcmpeqd_avx(auVar175,auVar175);
    auVar85 = ZEXT1664(auVar175);
    do {
      auVar175 = ZEXT816(0) << 0x40;
      if (pvVar20 != (void *)0x0) {
        auVar175 = ZEXT416(*(uint *)((long)pvVar20 + uVar35 * 4));
      }
      pfVar33 = (float *)((long)pvVar39 + uVar35 * lVar44 * 4);
      pfVar37 = (float *)uVar30;
      if ((int)uVar50 < 8) {
        fVar274 = 0.0;
        fVar277 = 0.0;
        fVar278 = 0.0;
        fVar279 = 0.0;
        fVar280 = 0.0;
        fVar281 = 0.0;
        fVar282 = 0.0;
        fVar283 = 0.0;
        uVar38 = 0;
      }
      else {
        fVar274 = 0.0;
        fVar277 = 0.0;
        fVar278 = 0.0;
        fVar279 = 0.0;
        fVar280 = 0.0;
        fVar281 = 0.0;
        fVar282 = 0.0;
        fVar283 = 0.0;
        iVar31 = 7;
        do {
          fVar274 = *pfVar33 * *pfVar37 + fVar274;
          fVar277 = pfVar33[1] * pfVar37[1] + fVar277;
          fVar278 = pfVar33[2] * pfVar37[2] + fVar278;
          fVar279 = pfVar33[3] * pfVar37[3] + fVar279;
          fVar280 = pfVar33[4] * pfVar37[4] + fVar280;
          fVar281 = pfVar33[5] * pfVar37[5] + fVar281;
          fVar282 = pfVar33[6] * pfVar37[6] + fVar282;
          fVar283 = pfVar33[7] + fVar283;
          pfVar37 = pfVar37 + 8;
          pfVar33 = pfVar33 + 8;
          iVar31 = iVar31 + 8;
          uVar38 = local_150;
        } while (iVar31 < (int)uVar50);
      }
      fVar86 = 0.0;
      fVar130 = 0.0;
      fVar131 = 0.0;
      fVar132 = 0.0;
      uVar34 = uVar38 | 3;
      while ((int)uVar34 < (int)uVar50) {
        fVar86 = *pfVar33 * *pfVar37 + fVar86;
        fVar130 = pfVar33[1] * pfVar37[1] + fVar130;
        fVar131 = pfVar33[2] * pfVar37[2] + fVar131;
        fVar132 = pfVar33[3] * pfVar37[3] + fVar132;
        pfVar37 = pfVar37 + 4;
        pfVar33 = pfVar33 + 4;
        uVar34 = uVar38 + 7;
        uVar38 = uVar38 + 4;
      }
      auVar218 = auVar129._0_16_;
      if ((int)uVar38 < (int)uVar50) {
        uVar42 = CONCAT44(0,~uVar38 + uVar50);
        auVar175 = vblendps_avx(auVar175,_DAT_005a3030,0xe);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = uVar42;
        auVar88 = vpshufd_avx(auVar151,0x44);
        auVar89 = vorps_avx(auVar218,auVar88);
        auVar179 = vorps_avx(auVar218,auVar88);
        uVar43 = 0;
        auVar165 = ZEXT1664(auVar175);
        do {
          auVar227 = auVar165;
          auVar208._8_8_ = 0;
          auVar208._0_8_ = uVar43;
          auVar175 = vpshufd_avx(auVar208,0x44);
          auVar226._16_16_ = auVar175;
          auVar226._0_16_ = auVar175;
          auVar76 = vorps_avx(auVar216._0_32_,auVar226);
          auVar110 = vorps_avx(auVar268._0_32_,auVar226);
          auVar175 = vorps_avx(auVar88,auVar218);
          uVar38 = auVar129._0_4_;
          auVar239._0_4_ = auVar110._16_4_ ^ uVar38;
          uVar34 = auVar129._4_4_;
          auVar239._4_4_ = auVar110._20_4_ ^ uVar34;
          uVar45 = auVar129._8_4_;
          auVar239._8_4_ = auVar110._24_4_ ^ uVar45;
          uVar47 = auVar129._12_4_;
          auVar239._12_4_ = auVar110._28_4_ ^ uVar47;
          auVar87 = vpcmpgtq_avx(auVar239,auVar175);
          auVar262._0_4_ = uVar38 ^ auVar110._0_4_;
          auVar262._4_4_ = uVar34 ^ auVar110._4_4_;
          auVar262._8_4_ = uVar45 ^ auVar110._8_4_;
          auVar262._12_4_ = uVar47 ^ auVar110._12_4_;
          auVar139 = vpcmpgtq_avx(auVar262,auVar89);
          auVar139 = vpackssdw_avx(auVar139,auVar87);
          auVar264._0_4_ = auVar76._16_4_ ^ uVar38;
          auVar264._4_4_ = auVar76._20_4_ ^ uVar34;
          auVar264._8_4_ = auVar76._24_4_ ^ uVar45;
          auVar264._12_4_ = auVar76._28_4_ ^ uVar47;
          auVar140 = vpcmpgtq_avx(auVar264,auVar175);
          auVar265._0_4_ = uVar38 ^ auVar76._0_4_;
          auVar265._4_4_ = uVar34 ^ auVar76._4_4_;
          auVar265._8_4_ = uVar45 ^ auVar76._8_4_;
          auVar265._12_4_ = uVar47 ^ auVar76._12_4_;
          auVar175 = vpcmpgtq_avx(auVar265,auVar179);
          auVar175 = vpackssdw_avx(auVar175,auVar140);
          auVar175 = vpackssdw_avx(auVar175 ^ auVar85._0_16_,auVar139 ^ auVar85._0_16_);
          auVar139 = vpmovsxwd_avx(auVar175);
          auVar175 = vpunpckhwd_avx(auVar175,auVar175);
          auVar267._16_16_ = auVar175;
          auVar267._0_16_ = auVar139;
          auVar160 = vmaskmovps_avx(auVar267,*(undefined1 (*) [32])(pfVar37 + uVar43));
          auVar58 = vmaskmovps_avx(auVar267,*(undefined1 (*) [32])(pfVar33 + uVar43));
          auVar175 = vpcmpeqd_avx(auVar160._0_16_,auVar160._0_16_);
          auVar85 = ZEXT1664(auVar175);
          auVar107._0_4_ = auVar227._0_4_ + auVar160._0_4_ * auVar58._0_4_;
          auVar107._4_4_ = auVar227._4_4_ + auVar160._4_4_ * auVar58._4_4_;
          auVar107._8_4_ = auVar227._8_4_ + auVar160._8_4_ * auVar58._8_4_;
          auVar107._12_4_ = auVar227._12_4_ + auVar160._12_4_ * auVar58._12_4_;
          auVar128._16_4_ = auVar227._16_4_ + auVar160._16_4_ * auVar58._16_4_;
          auVar128._0_16_ = auVar107;
          auVar128._20_4_ = auVar227._20_4_ + auVar160._20_4_ * auVar58._20_4_;
          auVar128._24_4_ = auVar227._24_4_ + auVar160._24_4_ * auVar58._24_4_;
          auVar128._28_4_ = auVar227._28_4_ + auVar58._28_4_;
          uVar43 = uVar43 + 8;
          auVar165 = ZEXT3264(auVar128);
        } while ((uVar42 + 8 & 0xfffffffffffffff8) != uVar43);
        auVar89 = vorps_avx(auVar218,auVar88);
        auVar213._0_4_ = uVar38 ^ auVar110._0_4_;
        auVar213._4_4_ = uVar34 ^ auVar110._4_4_;
        auVar213._8_4_ = uVar45 ^ auVar110._8_4_;
        auVar213._12_4_ = uVar47 ^ auVar110._12_4_;
        auVar89 = vpcmpgtq_avx(auVar213,auVar89);
        auVar89 = vpackssdw_avx(auVar89,auVar87);
        auVar218 = vorps_avx(auVar218,auVar88);
        auVar209._0_4_ = uVar38 ^ auVar76._0_4_;
        auVar209._4_4_ = uVar34 ^ auVar76._4_4_;
        auVar209._8_4_ = uVar45 ^ auVar76._8_4_;
        auVar209._12_4_ = uVar47 ^ auVar76._12_4_;
        auVar218 = vpcmpgtq_avx(auVar209,auVar218);
        auVar218 = vpackssdw_avx(auVar218,auVar140);
        auVar218 = vblendvps_avx(auVar227._0_16_,auVar107,auVar175 ^ auVar218);
        auVar175 = vblendvps_avx(auVar227._16_16_,auVar128._16_16_,auVar175 ^ auVar89);
        auVar175 = vhaddps_avx(auVar175,auVar218);
        auVar175 = vhaddps_avx(auVar175,auVar175);
        auVar175 = vhaddps_avx(auVar175,auVar175);
      }
      auVar57._0_4_ = fVar274 + fVar280 + fVar86;
      auVar57._4_4_ = fVar277 + fVar281 + fVar130;
      auVar57._8_4_ = fVar278 + fVar282 + fVar131;
      auVar57._12_4_ = fVar279 + fVar283 + fVar132;
      auVar218 = vhaddps_avx(auVar57,auVar57);
      auVar218 = vhaddps_avx(auVar218,auVar218);
      fVar274 = auVar218._0_4_ + auVar175._0_4_;
      auVar175 = ZEXT416((uint)fVar274);
      auVar218 = auVar85._0_16_;
      fVar277 = fVar274;
      switch(uVar18) {
      case 1:
        auVar175 = vmaxss_avx(auVar175,ZEXT416(0));
        fVar277 = auVar175._0_4_;
        break;
      case 2:
        auVar175 = vcmpss_avx(ZEXT816(0) << 0x20,auVar175,1);
        auVar109._8_4_ = 0x3f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._12_4_ = 0x3f800000;
        auVar175 = vblendvps_avx(ZEXT416((uint)*pfVar40),auVar109,auVar175);
        fVar277 = auVar175._0_4_;
LAB_002fbff0:
        fVar277 = fVar277 * fVar274;
        break;
      case 3:
        auVar175 = vmaxss_avx(auVar175,ZEXT416((uint)*pfVar40));
        fVar277 = auVar175._0_4_;
        if (pfVar40[1] < auVar175._0_4_) {
          fVar277 = pfVar40[1];
        }
        break;
      case 4:
        auVar175 = vminss_avx(auVar175,ZEXT416(0x42b0c0a5));
        auVar74._0_8_ = auVar175._0_8_ ^ 0x8000000080000000;
        auVar74._8_4_ = auVar175._8_4_ ^ 0x80000000;
        auVar74._12_4_ = auVar175._12_4_ ^ 0x80000000;
        auVar175 = vcmpss_avx(auVar175,ZEXT416(0xc2b0c0a5),1);
        auVar108._8_4_ = 0x42b0c0a5;
        auVar108._0_8_ = 0x42b0c0a542b0c0a5;
        auVar108._12_4_ = 0x42b0c0a5;
        auVar175 = vblendvps_avx(auVar74,auVar108,auVar175);
        fVar274 = expf(auVar175._0_4_);
        auVar175 = vpcmpeqd_avx(auVar218,auVar218);
        auVar85 = ZEXT1664(auVar175);
        auVar129 = ZEXT1664(local_e8);
        auVar268 = ZEXT3264(_DAT_005a48a0);
        auVar216 = ZEXT3264(_DAT_005a4880);
        fVar277 = 1.0 / (fVar274 + 1.0);
        break;
      case 5:
        fVar277 = expf(fVar274);
        fVar277 = logf(fVar277 + 1.0);
        fVar277 = tanhf(fVar277);
        auVar175 = vpcmpeqd_avx(auVar218,auVar218);
        auVar85 = ZEXT1664(auVar175);
        auVar129 = ZEXT1664(local_e8);
        auVar268 = ZEXT3264(_DAT_005a48a0);
        auVar216 = ZEXT3264(_DAT_005a4880);
        fVar277 = fVar277 * fVar274;
        break;
      case 6:
        fVar278 = *pfVar40;
        fVar279 = -pfVar40[1] / fVar278;
        fVar277 = 0.0;
        if ((fVar279 <= fVar274) && (fVar277 = fVar274, fVar274 <= fVar279 + 1.0 / fVar278)) {
          fVar277 = fVar278 * fVar274 + pfVar40[1];
          goto LAB_002fbff0;
        }
      }
      *(float *)((long)pvVar22 + uVar35 * 4) = fVar277;
      uVar35 = uVar35 + 1;
    } while (uVar35 != local_d0);
LAB_002fad00:
    iVar31 = 0;
  }
LAB_002fc05f:
  if ((int *)local_138._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_138._8_8_ == 0) {
      if (local_118 == (Allocator *)0x0) {
        if ((void *)local_138._0_8_ != (void *)0x0) {
          free((void *)local_138._0_8_);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int InnerProduct_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}